

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O1

void idct64_low16_ssse3(__m128i *input,__m128i *output)

{
  undefined4 uVar1;
  __m128i _in1_1;
  undefined1 auVar2 [16];
  __m128i _in0_1;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  __m128i _in1_2;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  __m128i _in0;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  __m128i alVar393;
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  __m128i _in1;
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar497 [16];
  undefined2 local_488;
  undefined2 uStack_486;
  undefined2 uStack_484;
  undefined2 uStack_482;
  undefined2 uStack_480;
  undefined2 uStack_47e;
  undefined2 uStack_47c;
  undefined2 uStack_47a;
  undefined2 local_468;
  undefined2 uStack_466;
  undefined2 uStack_464;
  undefined2 uStack_462;
  undefined2 uStack_460;
  undefined2 uStack_45e;
  undefined2 uStack_45c;
  undefined2 uStack_45a;
  undefined2 local_458;
  undefined2 uStack_456;
  undefined2 uStack_454;
  undefined2 uStack_452;
  undefined2 uStack_450;
  undefined2 uStack_44e;
  undefined2 uStack_44c;
  undefined2 uStack_44a;
  undefined2 local_448;
  undefined2 uStack_446;
  undefined2 uStack_444;
  undefined2 uStack_442;
  undefined2 uStack_440;
  undefined2 uStack_43e;
  undefined2 uStack_43c;
  undefined2 uStack_43a;
  undefined2 local_418;
  undefined2 uStack_416;
  undefined2 uStack_414;
  undefined2 uStack_412;
  undefined2 uStack_410;
  undefined2 uStack_40e;
  undefined2 uStack_40c;
  undefined2 uStack_40a;
  undefined2 local_408;
  undefined2 uStack_406;
  undefined2 uStack_404;
  undefined2 uStack_402;
  undefined2 uStack_400;
  undefined2 uStack_3fe;
  undefined2 uStack_3fc;
  undefined2 uStack_3fa;
  undefined2 local_3f8;
  undefined2 uStack_3f6;
  undefined2 uStack_3f4;
  undefined2 uStack_3f2;
  undefined2 uStack_3f0;
  undefined2 uStack_3ee;
  undefined2 uStack_3ec;
  undefined2 uStack_3ea;
  undefined2 local_398;
  undefined2 uStack_396;
  undefined2 uStack_394;
  undefined2 uStack_392;
  undefined2 uStack_390;
  undefined2 uStack_38e;
  undefined2 uStack_38c;
  undefined2 uStack_38a;
  undefined2 local_388;
  undefined2 uStack_386;
  undefined2 uStack_384;
  undefined2 uStack_382;
  undefined2 uStack_380;
  undefined2 uStack_37e;
  undefined2 uStack_37c;
  undefined2 uStack_37a;
  undefined2 local_368;
  undefined2 uStack_366;
  undefined2 uStack_364;
  undefined2 uStack_362;
  undefined2 uStack_360;
  undefined2 uStack_35e;
  undefined2 uStack_35c;
  undefined2 uStack_35a;
  undefined2 local_358;
  undefined2 uStack_356;
  undefined2 uStack_354;
  undefined2 uStack_352;
  undefined2 uStack_350;
  undefined2 uStack_34e;
  undefined2 uStack_34c;
  undefined2 uStack_34a;
  undefined2 local_348;
  undefined2 uStack_346;
  undefined2 uStack_344;
  undefined2 uStack_342;
  undefined2 uStack_340;
  undefined2 uStack_33e;
  undefined2 uStack_33c;
  undefined2 uStack_33a;
  undefined2 local_338;
  undefined2 uStack_336;
  undefined2 uStack_334;
  undefined2 uStack_332;
  undefined2 uStack_330;
  undefined2 uStack_32e;
  undefined2 uStack_32c;
  undefined2 uStack_32a;
  undefined2 local_328;
  undefined2 uStack_326;
  undefined2 uStack_324;
  undefined2 uStack_322;
  undefined2 uStack_320;
  undefined2 uStack_31e;
  undefined2 uStack_31c;
  undefined2 uStack_31a;
  undefined2 local_318;
  undefined2 uStack_316;
  undefined2 uStack_314;
  undefined2 uStack_312;
  undefined2 uStack_310;
  undefined2 uStack_30e;
  undefined2 uStack_30c;
  undefined2 uStack_30a;
  undefined2 local_308;
  undefined2 uStack_306;
  undefined2 uStack_304;
  undefined2 uStack_302;
  undefined2 uStack_300;
  undefined2 uStack_2fe;
  undefined2 uStack_2fc;
  undefined2 uStack_2fa;
  undefined2 local_2e8;
  undefined2 uStack_2e6;
  undefined2 uStack_2e4;
  undefined2 uStack_2e2;
  undefined2 uStack_2e0;
  undefined2 uStack_2de;
  undefined2 uStack_2dc;
  undefined2 uStack_2da;
  undefined2 local_2d8;
  undefined2 uStack_2d6;
  undefined2 uStack_2d4;
  undefined2 uStack_2d2;
  undefined2 uStack_2d0;
  undefined2 uStack_2ce;
  undefined2 uStack_2cc;
  undefined2 uStack_2ca;
  undefined2 local_288;
  undefined2 uStack_286;
  undefined2 uStack_284;
  undefined2 uStack_282;
  undefined2 uStack_280;
  undefined2 uStack_27e;
  undefined2 uStack_27c;
  undefined2 uStack_27a;
  undefined2 local_198;
  undefined2 uStack_196;
  undefined2 uStack_194;
  undefined2 uStack_192;
  undefined2 uStack_190;
  undefined2 uStack_18e;
  undefined2 uStack_18c;
  undefined2 uStack_18a;
  undefined2 local_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined2 uStack_180;
  undefined2 uStack_17e;
  undefined2 uStack_17c;
  undefined2 uStack_17a;
  undefined2 local_178;
  undefined2 uStack_176;
  undefined2 uStack_174;
  undefined2 uStack_172;
  undefined2 uStack_170;
  undefined2 uStack_16e;
  undefined2 uStack_16c;
  undefined2 uStack_16a;
  undefined2 local_168;
  undefined2 uStack_166;
  undefined2 uStack_164;
  undefined2 uStack_162;
  undefined2 uStack_160;
  undefined2 uStack_15e;
  undefined2 uStack_15c;
  undefined2 uStack_15a;
  undefined2 local_148;
  undefined2 uStack_146;
  undefined2 uStack_144;
  undefined2 uStack_142;
  undefined2 uStack_140;
  undefined2 uStack_13e;
  undefined2 uStack_13c;
  undefined2 uStack_13a;
  undefined2 local_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 uStack_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 local_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 uStack_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined2 local_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  undefined1 auVar12 [16];
  undefined1 auVar17 [16];
  undefined1 auVar23 [16];
  undefined1 auVar31 [16];
  undefined1 auVar47 [16];
  undefined1 auVar13 [16];
  undefined1 auVar18 [16];
  undefined1 auVar24 [16];
  undefined1 auVar32 [16];
  undefined1 auVar48 [16];
  undefined1 auVar14 [16];
  undefined1 auVar19 [16];
  undefined1 auVar25 [16];
  undefined1 auVar33 [16];
  undefined1 auVar49 [16];
  undefined1 auVar58 [16];
  undefined1 auVar80 [16];
  undefined1 auVar87 [16];
  undefined1 auVar59 [16];
  undefined1 auVar81 [16];
  undefined1 auVar88 [16];
  undefined1 auVar60 [16];
  undefined1 auVar82 [16];
  undefined1 auVar89 [16];
  undefined1 auVar125 [16];
  undefined1 auVar135 [16];
  undefined1 auVar126 [16];
  undefined1 auVar136 [16];
  undefined1 auVar127 [16];
  undefined1 auVar137 [16];
  undefined1 auVar166 [16];
  undefined1 auVar173 [16];
  undefined1 auVar182 [16];
  undefined1 auVar187 [16];
  undefined1 auVar199 [16];
  undefined1 auVar204 [16];
  undefined1 auVar209 [16];
  undefined1 auVar167 [16];
  undefined1 auVar174 [16];
  undefined1 auVar183 [16];
  undefined1 auVar188 [16];
  undefined1 auVar200 [16];
  undefined1 auVar205 [16];
  undefined1 auVar210 [16];
  undefined1 auVar168 [16];
  undefined1 auVar175 [16];
  undefined1 auVar184 [16];
  undefined1 auVar189 [16];
  undefined1 auVar201 [16];
  undefined1 auVar206 [16];
  undefined1 auVar211 [16];
  undefined1 auVar225 [16];
  undefined1 auVar230 [16];
  undefined1 auVar240 [16];
  undefined1 auVar226 [16];
  undefined1 auVar231 [16];
  undefined1 auVar241 [16];
  undefined1 auVar227 [16];
  undefined1 auVar232 [16];
  undefined1 auVar242 [16];
  undefined1 auVar262 [16];
  undefined1 auVar268 [16];
  undefined1 auVar279 [16];
  undefined1 auVar284 [16];
  undefined1 auVar263 [16];
  undefined1 auVar269 [16];
  undefined1 auVar280 [16];
  undefined1 auVar285 [16];
  undefined1 auVar264 [16];
  undefined1 auVar270 [16];
  undefined1 auVar281 [16];
  undefined1 auVar286 [16];
  undefined1 auVar307 [16];
  undefined1 auVar316 [16];
  undefined1 auVar324 [16];
  undefined1 auVar308 [16];
  undefined1 auVar317 [16];
  undefined1 auVar325 [16];
  undefined1 auVar309 [16];
  undefined1 auVar318 [16];
  undefined1 auVar326 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar356 [16];
  undefined1 auVar367 [16];
  undefined1 auVar373 [16];
  undefined1 auVar357 [16];
  undefined1 auVar368 [16];
  undefined1 auVar374 [16];
  undefined1 auVar358 [16];
  undefined1 auVar369 [16];
  undefined1 auVar375 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar405 [16];
  undefined1 auVar410 [16];
  undefined1 auVar406 [16];
  undefined1 auVar411 [16];
  undefined1 auVar407 [16];
  undefined1 auVar412 [16];
  undefined1 auVar417 [16];
  undefined1 auVar426 [16];
  undefined1 auVar418 [16];
  undefined1 auVar427 [16];
  undefined1 auVar419 [16];
  undefined1 auVar428 [16];
  undefined1 auVar433 [16];
  undefined1 auVar444 [16];
  undefined1 auVar434 [16];
  undefined1 auVar445 [16];
  undefined1 auVar435 [16];
  undefined1 auVar446 [16];
  undefined1 auVar460 [16];
  undefined1 auVar465 [16];
  undefined1 auVar470 [16];
  undefined1 auVar475 [16];
  undefined1 auVar461 [16];
  undefined1 auVar466 [16];
  undefined1 auVar471 [16];
  undefined1 auVar476 [16];
  undefined1 auVar462 [16];
  undefined1 auVar467 [16];
  undefined1 auVar472 [16];
  undefined1 auVar477 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  
  auVar288 = pshuflw(ZEXT416(0x328),ZEXT416(0x328),0);
  uVar1 = auVar288._0_4_;
  auVar394._4_4_ = uVar1;
  auVar394._0_4_ = uVar1;
  auVar394._8_4_ = uVar1;
  auVar394._12_4_ = uVar1;
  auVar288 = pshuflw(ZEXT416(0x7ff8),ZEXT416(0x7ff8),0);
  uVar1 = auVar288._0_4_;
  auVar449._4_4_ = uVar1;
  auVar449._0_4_ = uVar1;
  auVar449._8_4_ = uVar1;
  auVar449._12_4_ = uVar1;
  auVar395 = pmulhrsw(auVar394,(undefined1  [16])input[1]);
  auVar450 = pmulhrsw(auVar449,(undefined1  [16])input[1]);
  auVar288 = pshuflw(ZEXT416(0xffffd1f0),ZEXT416(0xffffd1f0),0);
  auVar53._0_4_ = auVar288._0_4_;
  auVar53._4_4_ = auVar53._0_4_;
  auVar53._8_4_ = auVar53._0_4_;
  auVar53._12_4_ = auVar53._0_4_;
  auVar288 = pshuflw(ZEXT416(0x7770),ZEXT416(0x7770),0);
  uVar1 = auVar288._0_4_;
  auVar328._4_4_ = uVar1;
  auVar328._0_4_ = uVar1;
  auVar328._8_4_ = uVar1;
  auVar328._12_4_ = uVar1;
  auVar54 = pmulhrsw(auVar53,(undefined1  [16])input[0xf]);
  auVar329 = pmulhrsw(auVar328,(undefined1  [16])input[0xf]);
  auVar288 = pshuflw(ZEXT416(0x1c08),ZEXT416(0x1c08),0);
  uVar1 = auVar288._0_4_;
  auVar353._4_4_ = uVar1;
  auVar353._0_4_ = uVar1;
  auVar353._8_4_ = uVar1;
  auVar353._12_4_ = uVar1;
  auVar288 = pshuflw(ZEXT416(0x7ce0),ZEXT416(0x7ce0),0);
  uVar1 = auVar288._0_4_;
  auVar377._4_4_ = uVar1;
  auVar377._0_4_ = uVar1;
  auVar377._8_4_ = uVar1;
  auVar377._12_4_ = uVar1;
  auVar354 = pmulhrsw(auVar353,(undefined1  [16])input[9]);
  auVar378 = pmulhrsw(auVar377,(undefined1  [16])input[9]);
  auVar288 = pshuflw(ZEXT416(0xffffea20),ZEXT416(0xffffea20),0);
  uVar1 = auVar288._0_4_;
  auVar289._4_4_ = uVar1;
  auVar289._0_4_ = uVar1;
  auVar289._8_4_ = uVar1;
  auVar289._12_4_ = uVar1;
  auVar288 = pshuflw(ZEXT416(0x7e20),ZEXT416(0x7e20),0);
  uVar1 = auVar288._0_4_;
  auVar430._4_4_ = uVar1;
  auVar430._0_4_ = uVar1;
  auVar430._8_4_ = uVar1;
  auVar430._12_4_ = uVar1;
  auVar290 = pmulhrsw(auVar289,(undefined1  [16])input[7]);
  auVar431 = pmulhrsw(auVar430,(undefined1  [16])input[7]);
  auVar288 = pshuflw(ZEXT416(0xfa8),ZEXT416(0xfa8),0);
  uVar1 = auVar288._0_4_;
  auVar288._4_4_ = uVar1;
  auVar288._0_4_ = uVar1;
  auVar288._8_4_ = uVar1;
  auVar288._12_4_ = uVar1;
  auVar213 = pshuflw(ZEXT416(0x7f08),ZEXT416(0x7f08),0);
  uVar1 = auVar213._0_4_;
  auVar479._4_4_ = uVar1;
  auVar479._0_4_ = uVar1;
  auVar479._8_4_ = uVar1;
  auVar479._12_4_ = uVar1;
  auVar288 = pmulhrsw(auVar288,(undefined1  [16])input[5]);
  auVar480 = pmulhrsw(auVar479,(undefined1  [16])input[5]);
  auVar213 = pshuflw(ZEXT416(0xffffdde0),ZEXT416(0xffffdde0),0);
  uVar1 = auVar213._0_4_;
  auVar214._4_4_ = uVar1;
  auVar214._0_4_ = uVar1;
  auVar214._8_4_ = uVar1;
  auVar214._12_4_ = uVar1;
  auVar213 = pshuflw(ZEXT416(0x7b60),ZEXT416(0x7b60),0);
  uVar1 = auVar213._0_4_;
  auVar213._4_4_ = uVar1;
  auVar213._0_4_ = uVar1;
  auVar213._8_4_ = uVar1;
  auVar213._12_4_ = uVar1;
  auVar215 = pmulhrsw(auVar214,(undefined1  [16])input[0xb]);
  auVar213 = pmulhrsw(auVar213,(undefined1  [16])input[0xb]);
  auVar103 = pshuflw(ZEXT416(0x2828),ZEXT416(0x2828),0);
  uVar1 = auVar103._0_4_;
  auVar414._4_4_ = uVar1;
  auVar414._0_4_ = uVar1;
  auVar414._8_4_ = uVar1;
  auVar414._12_4_ = uVar1;
  auVar103 = pshuflw(ZEXT416(0x7988),ZEXT416(0x7988),0);
  uVar1 = auVar103._0_4_;
  auVar103._4_4_ = uVar1;
  auVar103._0_4_ = uVar1;
  auVar103._8_4_ = uVar1;
  auVar103._12_4_ = uVar1;
  auVar415 = pmulhrsw(auVar414,(undefined1  [16])input[0xd]);
  auVar103 = pmulhrsw(auVar103,(undefined1  [16])input[0xd]);
  auVar3 = pshuflw(ZEXT416(0xfffff698),ZEXT416(0xfffff698),0);
  uVar1 = auVar3._0_4_;
  auVar104._4_4_ = uVar1;
  auVar104._0_4_ = uVar1;
  auVar104._8_4_ = uVar1;
  auVar104._12_4_ = uVar1;
  auVar3 = pshuflw(ZEXT416(0x7fa8),ZEXT416(0x7fa8),0);
  uVar1 = auVar3._0_4_;
  auVar3._4_4_ = uVar1;
  auVar3._0_4_ = uVar1;
  auVar3._8_4_ = uVar1;
  auVar3._12_4_ = uVar1;
  auVar105 = pmulhrsw(auVar104,(undefined1  [16])input[3]);
  auVar3 = pmulhrsw(auVar3,(undefined1  [16])input[3]);
  auVar4 = pshuflw(ZEXT416(0x648),ZEXT416(0x648),0);
  uVar1 = auVar4._0_4_;
  auVar4._4_4_ = uVar1;
  auVar4._0_4_ = uVar1;
  auVar4._8_4_ = uVar1;
  auVar4._12_4_ = uVar1;
  auVar5 = pshuflw(ZEXT416(0x7fd8),ZEXT416(0x7fd8),0);
  uVar1 = auVar5._0_4_;
  auVar106._4_4_ = uVar1;
  auVar106._0_4_ = uVar1;
  auVar106._8_4_ = uVar1;
  auVar106._12_4_ = uVar1;
  auVar4 = pmulhrsw(auVar4,(undefined1  [16])input[2]);
  auVar107 = pmulhrsw(auVar106,(undefined1  [16])input[2]);
  auVar5 = pshuflw(ZEXT416(0xffffd4e0),ZEXT416(0xffffd4e0),0);
  uVar1 = auVar5._0_4_;
  auVar5._4_4_ = uVar1;
  auVar5._0_4_ = uVar1;
  auVar5._8_4_ = uVar1;
  auVar5._12_4_ = uVar1;
  auVar6 = pshuflw(ZEXT416(0x7888),ZEXT416(0x7888),0);
  uVar1 = auVar6._0_4_;
  auVar108._4_4_ = uVar1;
  auVar108._0_4_ = uVar1;
  auVar108._8_4_ = uVar1;
  auVar108._12_4_ = uVar1;
  auVar5 = pmulhrsw(auVar5,(undefined1  [16])input[0xe]);
  auVar109 = pmulhrsw(auVar108,(undefined1  [16])input[0xe]);
  auVar6 = pshuflw(ZEXT416(0x1f18),ZEXT416(0x1f18),0);
  uVar1 = auVar6._0_4_;
  auVar159._4_4_ = uVar1;
  auVar159._0_4_ = uVar1;
  auVar159._8_4_ = uVar1;
  auVar159._12_4_ = uVar1;
  auVar6 = pshuflw(ZEXT416(0x7c28),ZEXT416(0x7c28),0);
  uVar1 = auVar6._0_4_;
  auVar110._4_4_ = uVar1;
  auVar110._0_4_ = uVar1;
  auVar110._8_4_ = uVar1;
  auVar110._12_4_ = uVar1;
  auVar160 = pmulhrsw(auVar159,(undefined1  [16])input[10]);
  auVar111 = pmulhrsw(auVar110,(undefined1  [16])input[10]);
  auVar6 = pshuflw(ZEXT416(0xffffed38),ZEXT416(0xffffed38),0);
  uVar1 = auVar6._0_4_;
  auVar161._4_4_ = uVar1;
  auVar161._0_4_ = uVar1;
  auVar161._8_4_ = uVar1;
  auVar161._12_4_ = uVar1;
  auVar6 = pshuflw(ZEXT416(0x7ea0),ZEXT416(0x7ea0),0);
  uVar1 = auVar6._0_4_;
  auVar112._4_4_ = uVar1;
  auVar112._0_4_ = uVar1;
  auVar112._8_4_ = uVar1;
  auVar112._12_4_ = uVar1;
  auVar162 = pmulhrsw(auVar161,(undefined1  [16])input[6]);
  auVar113 = pmulhrsw(auVar112,(undefined1  [16])input[6]);
  auVar6 = pshuflw(ZEXT416(0xc88),ZEXT416(0xc88),0);
  uVar1 = auVar6._0_4_;
  auVar114._4_4_ = uVar1;
  auVar114._0_4_ = uVar1;
  auVar114._8_4_ = uVar1;
  auVar114._12_4_ = uVar1;
  auVar6 = pshuflw(ZEXT416(0x7f60),ZEXT416(0x7f60),0);
  uVar1 = auVar6._0_4_;
  auVar249._4_4_ = uVar1;
  auVar249._0_4_ = uVar1;
  auVar249._8_4_ = uVar1;
  auVar249._12_4_ = uVar1;
  auVar115 = pmulhrsw(auVar114,(undefined1  [16])input[4]);
  auVar250 = pmulhrsw(auVar249,(undefined1  [16])input[4]);
  auVar6 = pshuflw(ZEXT416(0xffffdad8),ZEXT416(0xffffdad8),0);
  uVar1 = auVar6._0_4_;
  auVar116._4_4_ = uVar1;
  auVar116._0_4_ = uVar1;
  auVar116._8_4_ = uVar1;
  auVar116._12_4_ = uVar1;
  auVar6 = pshuflw(ZEXT416(0x7a80),ZEXT416(0x7a80),0);
  uVar1 = auVar6._0_4_;
  auVar251._4_4_ = uVar1;
  auVar251._0_4_ = uVar1;
  auVar251._8_4_ = uVar1;
  auVar251._12_4_ = uVar1;
  auVar117 = pmulhrsw(auVar116,(undefined1  [16])input[0xc]);
  auVar252 = pmulhrsw(auVar251,(undefined1  [16])input[0xc]);
  auVar396._0_12_ = auVar395._0_12_;
  auVar396._12_2_ = auVar395._6_2_;
  auVar396._14_2_ = auVar450._6_2_;
  auVar119._12_4_ = auVar396._12_4_;
  auVar119._0_10_ = auVar395._0_10_;
  auVar119._10_2_ = auVar450._4_2_;
  auVar2._10_6_ = auVar119._10_6_;
  auVar2._0_8_ = auVar395._0_8_;
  auVar2._8_2_ = auVar395._4_2_;
  auVar6._8_8_ = auVar2._8_8_;
  auVar6._6_2_ = auVar450._2_2_;
  auVar6._4_2_ = auVar395._2_2_;
  auVar6._0_2_ = auVar395._0_2_;
  auVar6._2_2_ = auVar450._0_2_;
  auVar118._2_2_ = auVar450._8_2_;
  auVar118._0_2_ = auVar395._8_2_;
  auVar118._4_2_ = auVar395._10_2_;
  auVar118._6_2_ = auVar450._10_2_;
  auVar118._8_2_ = auVar395._12_2_;
  auVar118._10_2_ = auVar450._12_2_;
  auVar118._12_2_ = auVar395._14_2_;
  auVar118._14_2_ = auVar450._14_2_;
  auVar291._8_4_ = 0xfec0191;
  auVar291._0_8_ = 0xfec01910fec0191;
  auVar291._12_4_ = 0xfec0191;
  auVar2 = pmaddwd(auVar6,auVar291);
  auVar119 = pmaddwd(auVar118,auVar291);
  auVar305._8_4_ = 0x191f014;
  auVar305._0_8_ = 0x191f0140191f014;
  auVar305._12_4_ = 0x191f014;
  auVar396 = pmaddwd(auVar6,auVar305);
  auVar6 = pmaddwd(auVar118,auVar305);
  auVar397._0_4_ = auVar396._0_4_ + 0x800 >> 0xc;
  auVar397._4_4_ = auVar396._4_4_ + 0x800 >> 0xc;
  auVar397._8_4_ = auVar396._8_4_ + 0x800 >> 0xc;
  auVar397._12_4_ = auVar396._12_4_ + 0x800 >> 0xc;
  auVar253._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar253._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar253._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar253._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar398 = packssdw(auVar397,auVar253);
  auVar254._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar254._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar254._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar254._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar120._0_4_ = auVar119._0_4_ + 0x800 >> 0xc;
  auVar120._4_4_ = auVar119._4_4_ + 0x800 >> 0xc;
  auVar120._8_4_ = auVar119._8_4_ + 0x800 >> 0xc;
  auVar120._12_4_ = auVar119._12_4_ + 0x800 >> 0xc;
  auVar6 = packssdw(auVar254,auVar120);
  auVar121 = paddsw(auVar395,auVar54);
  auVar451 = psubsw(auVar395,auVar54);
  auVar395._0_12_ = auVar54._0_12_;
  auVar395._12_2_ = auVar54._6_2_;
  auVar395._14_2_ = auVar329._6_2_;
  auVar452._12_4_ = auVar395._12_4_;
  auVar452._0_10_ = auVar54._0_10_;
  auVar452._10_2_ = auVar329._4_2_;
  auVar65._10_6_ = auVar452._10_6_;
  auVar65._0_8_ = auVar54._0_8_;
  auVar65._8_2_ = auVar54._4_2_;
  auVar217._8_8_ = auVar65._8_8_;
  auVar217._6_2_ = auVar329._2_2_;
  auVar217._4_2_ = auVar54._2_2_;
  auVar217._0_2_ = auVar54._0_2_;
  auVar217._2_2_ = auVar329._0_2_;
  auVar122._2_2_ = auVar329._8_2_;
  auVar122._0_2_ = auVar54._8_2_;
  auVar122._4_2_ = auVar54._10_2_;
  auVar122._6_2_ = auVar329._10_2_;
  auVar122._8_2_ = auVar54._12_2_;
  auVar122._10_2_ = auVar329._12_2_;
  auVar122._12_2_ = auVar54._14_2_;
  auVar122._14_2_ = auVar329._14_2_;
  auVar55._8_4_ = 0xf014fe6f;
  auVar55._0_8_ = 0xf014fe6ff014fe6f;
  auVar55._12_4_ = 0xf014fe6f;
  auVar254 = pmaddwd(auVar217,auVar55);
  auVar119 = pmaddwd(auVar55,auVar122);
  auVar2 = pmaddwd(auVar217,auVar305);
  auVar396 = pmaddwd(auVar122,auVar305);
  auVar255._0_4_ = auVar254._0_4_ + 0x800 >> 0xc;
  auVar255._4_4_ = auVar254._4_4_ + 0x800 >> 0xc;
  auVar255._8_4_ = auVar254._8_4_ + 0x800 >> 0xc;
  auVar255._12_4_ = auVar254._12_4_ + 0x800 >> 0xc;
  auVar56._0_4_ = auVar119._0_4_ + 0x800 >> 0xc;
  auVar56._4_4_ = auVar119._4_4_ + 0x800 >> 0xc;
  auVar56._8_4_ = auVar119._8_4_ + 0x800 >> 0xc;
  auVar56._12_4_ = auVar119._12_4_ + 0x800 >> 0xc;
  auVar256 = packssdw(auVar255,auVar56);
  auVar54._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar54._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar54._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar54._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar123._0_4_ = auVar396._0_4_ + 0x800 >> 0xc;
  auVar123._4_4_ = auVar396._4_4_ + 0x800 >> 0xc;
  auVar123._8_4_ = auVar396._8_4_ + 0x800 >> 0xc;
  auVar123._12_4_ = auVar396._12_4_ + 0x800 >> 0xc;
  auVar2 = packssdw(auVar54,auVar123);
  auVar119 = psubsw(auVar290,auVar354);
  auVar291 = paddsw(auVar290,auVar354);
  auVar127._0_12_ = auVar354._0_12_;
  auVar127._12_2_ = auVar354._6_2_;
  auVar127._14_2_ = auVar378._6_2_;
  auVar126._12_4_ = auVar127._12_4_;
  auVar126._0_10_ = auVar354._0_10_;
  auVar126._10_2_ = auVar378._4_2_;
  auVar125._10_6_ = auVar126._10_6_;
  auVar125._0_8_ = auVar354._0_8_;
  auVar125._8_2_ = auVar354._4_2_;
  auVar124._8_8_ = auVar125._8_8_;
  auVar124._6_2_ = auVar378._2_2_;
  auVar124._4_2_ = auVar354._2_2_;
  auVar124._0_2_ = auVar354._0_2_;
  auVar124._2_2_ = auVar378._0_2_;
  auVar257._2_2_ = auVar378._8_2_;
  auVar257._0_2_ = auVar354._8_2_;
  auVar257._4_2_ = auVar354._10_2_;
  auVar257._6_2_ = auVar378._10_2_;
  auVar257._8_2_ = auVar354._12_2_;
  auVar257._10_2_ = auVar378._12_2_;
  auVar257._12_2_ = auVar354._14_2_;
  auVar257._14_2_ = auVar378._14_2_;
  auVar354._8_4_ = 0xa260c5e;
  auVar354._0_8_ = 0xa260c5e0a260c5e;
  auVar354._12_4_ = 0xa260c5e;
  auVar396 = pmaddwd(auVar124,auVar354);
  auVar254 = pmaddwd(auVar257,auVar354);
  auVar62._8_4_ = 0xc5ef5da;
  auVar62._0_8_ = 0xc5ef5da0c5ef5da;
  auVar62._12_4_ = 0xc5ef5da;
  auVar452 = pmaddwd(auVar124,auVar62);
  auVar395 = pmaddwd(auVar257,auVar62);
  auVar453._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar453._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar453._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar453._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar292._0_4_ = auVar395._0_4_ + 0x800 >> 0xc;
  auVar292._4_4_ = auVar395._4_4_ + 0x800 >> 0xc;
  auVar292._8_4_ = auVar395._8_4_ + 0x800 >> 0xc;
  auVar292._12_4_ = auVar395._12_4_ + 0x800 >> 0xc;
  auVar454 = packssdw(auVar453,auVar292);
  auVar128._0_4_ = auVar396._0_4_ + 0x800 >> 0xc;
  auVar128._4_4_ = auVar396._4_4_ + 0x800 >> 0xc;
  auVar128._8_4_ = auVar396._8_4_ + 0x800 >> 0xc;
  auVar128._12_4_ = auVar396._12_4_ + 0x800 >> 0xc;
  auVar258._0_4_ = auVar254._0_4_ + 0x800 >> 0xc;
  auVar258._4_4_ = auVar254._4_4_ + 0x800 >> 0xc;
  auVar258._8_4_ = auVar254._8_4_ + 0x800 >> 0xc;
  auVar258._12_4_ = auVar254._12_4_ + 0x800 >> 0xc;
  auVar129 = packssdw(auVar128,auVar258);
  auVar60._0_12_ = auVar290._0_12_;
  auVar60._12_2_ = auVar290._6_2_;
  auVar60._14_2_ = auVar431._6_2_;
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._0_10_ = auVar290._0_10_;
  auVar59._10_2_ = auVar431._4_2_;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._0_8_ = auVar290._0_8_;
  auVar58._8_2_ = auVar290._4_2_;
  auVar57._8_8_ = auVar58._8_8_;
  auVar57._6_2_ = auVar431._2_2_;
  auVar57._4_2_ = auVar290._2_2_;
  auVar57._0_2_ = auVar290._0_2_;
  auVar57._2_2_ = auVar431._0_2_;
  auVar401._2_2_ = auVar431._8_2_;
  auVar401._0_2_ = auVar290._8_2_;
  auVar401._4_2_ = auVar290._10_2_;
  auVar401._6_2_ = auVar431._10_2_;
  auVar401._8_2_ = auVar290._12_2_;
  auVar401._10_2_ = auVar431._12_2_;
  auVar401._12_2_ = auVar290._14_2_;
  auVar401._14_2_ = auVar431._14_2_;
  auVar259._8_4_ = 0xf5daf3a2;
  auVar259._0_8_ = 0xf5daf3a2f5daf3a2;
  auVar259._12_4_ = 0xf5daf3a2;
  auVar452 = pmaddwd(auVar57,auVar259);
  auVar395 = pmaddwd(auVar259,auVar401);
  auVar254 = pmaddwd(auVar57,auVar62);
  auVar396 = pmaddwd(auVar401,auVar62);
  auVar293._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar293._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar293._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar293._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar260._0_4_ = auVar395._0_4_ + 0x800 >> 0xc;
  auVar260._4_4_ = auVar395._4_4_ + 0x800 >> 0xc;
  auVar260._8_4_ = auVar395._8_4_ + 0x800 >> 0xc;
  auVar260._12_4_ = auVar395._12_4_ + 0x800 >> 0xc;
  auVar294 = packssdw(auVar293,auVar260);
  auVar61._0_4_ = auVar254._0_4_ + 0x800 >> 0xc;
  auVar61._4_4_ = auVar254._4_4_ + 0x800 >> 0xc;
  auVar61._8_4_ = auVar254._8_4_ + 0x800 >> 0xc;
  auVar61._12_4_ = auVar254._12_4_ + 0x800 >> 0xc;
  auVar389._0_4_ = auVar396._0_4_ + 0x800 >> 0xc;
  auVar389._4_4_ = auVar396._4_4_ + 0x800 >> 0xc;
  auVar389._8_4_ = auVar396._8_4_ + 0x800 >> 0xc;
  auVar389._12_4_ = auVar396._12_4_ + 0x800 >> 0xc;
  auVar62 = packssdw(auVar61,auVar389);
  auVar435._0_12_ = auVar288._0_12_;
  auVar435._12_2_ = auVar288._6_2_;
  auVar435._14_2_ = auVar480._6_2_;
  auVar434._12_4_ = auVar435._12_4_;
  auVar434._0_10_ = auVar288._0_10_;
  auVar434._10_2_ = auVar480._4_2_;
  auVar433._10_6_ = auVar434._10_6_;
  auVar433._0_8_ = auVar288._0_8_;
  auVar433._8_2_ = auVar288._4_2_;
  auVar432._8_8_ = auVar433._8_8_;
  auVar432._6_2_ = auVar480._2_2_;
  auVar432._4_2_ = auVar288._2_2_;
  auVar432._0_2_ = auVar288._0_2_;
  auVar432._2_2_ = auVar480._0_2_;
  auVar481._2_2_ = auVar480._8_2_;
  auVar481._0_2_ = auVar288._8_2_;
  auVar481._4_2_ = auVar288._10_2_;
  auVar481._6_2_ = auVar480._10_2_;
  auVar481._8_2_ = auVar288._12_2_;
  auVar481._10_2_ = auVar480._12_2_;
  auVar481._12_2_ = auVar288._14_2_;
  auVar481._14_2_ = auVar480._14_2_;
  auVar290._8_4_ = 0xe1c078b;
  auVar290._0_8_ = 0xe1c078b0e1c078b;
  auVar290._12_4_ = 0xe1c078b;
  auVar452 = pmaddwd(auVar432,auVar290);
  auVar396 = pmaddwd(auVar481,auVar290);
  auVar360._8_4_ = 0x78bf1e4;
  auVar360._0_8_ = 0x78bf1e4078bf1e4;
  auVar360._12_4_ = 0x78bf1e4;
  auVar395 = pmaddwd(auVar432,auVar360);
  auVar254 = pmaddwd(auVar481,auVar360);
  auVar399._0_4_ = auVar395._0_4_ + 0x800 >> 0xc;
  auVar399._4_4_ = auVar395._4_4_ + 0x800 >> 0xc;
  auVar399._8_4_ = auVar395._8_4_ + 0x800 >> 0xc;
  auVar399._12_4_ = auVar395._12_4_ + 0x800 >> 0xc;
  auVar295._0_4_ = auVar254._0_4_ + 0x800 >> 0xc;
  auVar295._4_4_ = auVar254._4_4_ + 0x800 >> 0xc;
  auVar295._8_4_ = auVar254._8_4_ + 0x800 >> 0xc;
  auVar295._12_4_ = auVar254._12_4_ + 0x800 >> 0xc;
  auVar400 = packssdw(auVar399,auVar295);
  auVar436._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar436._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar436._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar436._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar438._0_4_ = auVar396._0_4_ + 0x800 >> 0xc;
  auVar438._4_4_ = auVar396._4_4_ + 0x800 >> 0xc;
  auVar438._8_4_ = auVar396._8_4_ + 0x800 >> 0xc;
  auVar438._12_4_ = auVar396._12_4_ + 0x800 >> 0xc;
  auVar437 = packssdw(auVar436,auVar438);
  auVar7 = paddsw(auVar288,auVar215);
  auVar63 = psubsw(auVar288,auVar215);
  local_418 = auVar213._0_2_;
  uStack_416 = auVar213._2_2_;
  uStack_414 = auVar213._4_2_;
  uStack_412 = auVar213._6_2_;
  uStack_410 = auVar213._8_2_;
  uStack_40e = auVar213._10_2_;
  uStack_40c = auVar213._12_2_;
  uStack_40a = auVar213._14_2_;
  auVar264._0_12_ = auVar215._0_12_;
  auVar264._12_2_ = auVar215._6_2_;
  auVar264._14_2_ = uStack_412;
  auVar263._12_4_ = auVar264._12_4_;
  auVar263._0_10_ = auVar215._0_10_;
  auVar263._10_2_ = uStack_414;
  auVar262._10_6_ = auVar263._10_6_;
  auVar262._0_8_ = auVar215._0_8_;
  auVar262._8_2_ = auVar215._4_2_;
  auVar261._8_8_ = auVar262._8_8_;
  auVar261._6_2_ = uStack_416;
  auVar261._4_2_ = auVar215._2_2_;
  auVar261._0_2_ = auVar215._0_2_;
  auVar261._2_2_ = local_418;
  auVar440._2_2_ = uStack_410;
  auVar440._0_2_ = auVar215._8_2_;
  auVar440._4_2_ = auVar215._10_2_;
  auVar440._6_2_ = uStack_40e;
  auVar440._8_2_ = auVar215._12_2_;
  auVar440._10_2_ = uStack_40c;
  auVar440._12_2_ = auVar215._14_2_;
  auVar440._14_2_ = uStack_40a;
  auVar296._8_4_ = 0xf1e4f875;
  auVar296._0_8_ = 0xf1e4f875f1e4f875;
  auVar296._12_4_ = 0xf1e4f875;
  auVar396 = pmaddwd(auVar261,auVar296);
  auVar395 = pmaddwd(auVar296,auVar440);
  auVar254 = pmaddwd(auVar261,auVar360);
  auVar288 = pmaddwd(auVar440,auVar360);
  auVar216._0_4_ = auVar396._0_4_ + 0x800 >> 0xc;
  auVar216._4_4_ = auVar396._4_4_ + 0x800 >> 0xc;
  auVar216._8_4_ = auVar396._8_4_ + 0x800 >> 0xc;
  auVar216._12_4_ = auVar396._12_4_ + 0x800 >> 0xc;
  auVar297._0_4_ = auVar395._0_4_ + 0x800 >> 0xc;
  auVar297._4_4_ = auVar395._4_4_ + 0x800 >> 0xc;
  auVar297._8_4_ = auVar395._8_4_ + 0x800 >> 0xc;
  auVar297._12_4_ = auVar395._12_4_ + 0x800 >> 0xc;
  auVar217 = packssdw(auVar216,auVar297);
  auVar265._0_4_ = auVar254._0_4_ + 0x800 >> 0xc;
  auVar265._4_4_ = auVar254._4_4_ + 0x800 >> 0xc;
  auVar265._8_4_ = auVar254._8_4_ + 0x800 >> 0xc;
  auVar265._12_4_ = auVar254._12_4_ + 0x800 >> 0xc;
  auVar456._0_4_ = auVar288._0_4_ + 0x800 >> 0xc;
  auVar456._4_4_ = auVar288._4_4_ + 0x800 >> 0xc;
  auVar456._8_4_ = auVar288._8_4_ + 0x800 >> 0xc;
  auVar456._12_4_ = auVar288._12_4_ + 0x800 >> 0xc;
  auVar54 = packssdw(auVar265,auVar456);
  auVar290 = psubsw(auVar105,auVar415);
  auVar288 = paddsw(auVar105,auVar415);
  local_408 = auVar103._0_2_;
  uStack_406 = auVar103._2_2_;
  uStack_404 = auVar103._4_2_;
  uStack_402 = auVar103._6_2_;
  uStack_400 = auVar103._8_2_;
  uStack_3fe = auVar103._10_2_;
  uStack_3fc = auVar103._12_2_;
  uStack_3fa = auVar103._14_2_;
  auVar419._0_12_ = auVar415._0_12_;
  auVar419._12_2_ = auVar415._6_2_;
  auVar419._14_2_ = uStack_402;
  auVar418._12_4_ = auVar419._12_4_;
  auVar418._0_10_ = auVar415._0_10_;
  auVar418._10_2_ = uStack_404;
  auVar417._10_6_ = auVar418._10_6_;
  auVar417._0_8_ = auVar415._0_8_;
  auVar417._8_2_ = auVar415._4_2_;
  auVar416._8_8_ = auVar417._8_8_;
  auVar416._6_2_ = uStack_406;
  auVar416._4_2_ = auVar415._2_2_;
  auVar416._0_2_ = auVar415._0_2_;
  auVar416._2_2_ = local_408;
  auVar298._2_2_ = uStack_400;
  auVar298._0_2_ = auVar415._8_2_;
  auVar298._4_2_ = auVar415._10_2_;
  auVar298._6_2_ = uStack_3fe;
  auVar298._8_2_ = auVar415._12_2_;
  auVar298._10_2_ = uStack_3fc;
  auVar298._12_2_ = auVar415._14_2_;
  auVar298._14_2_ = uStack_3fa;
  auVar330._8_4_ = 0x4a50f50;
  auVar330._0_8_ = 0x4a50f5004a50f50;
  auVar330._12_4_ = 0x4a50f50;
  auVar452 = pmaddwd(auVar416,auVar330);
  auVar254 = pmaddwd(auVar298,auVar330);
  auVar331._8_4_ = 0xf50fb5b;
  auVar331._0_8_ = 0xf50fb5b0f50fb5b;
  auVar331._12_4_ = 0xf50fb5b;
  auVar396 = pmaddwd(auVar416,auVar331);
  auVar395 = pmaddwd(auVar298,auVar331);
  auVar64._0_4_ = auVar396._0_4_ + 0x800 >> 0xc;
  auVar64._4_4_ = auVar396._4_4_ + 0x800 >> 0xc;
  auVar64._8_4_ = auVar396._8_4_ + 0x800 >> 0xc;
  auVar64._12_4_ = auVar396._12_4_ + 0x800 >> 0xc;
  auVar379._0_4_ = auVar395._0_4_ + 0x800 >> 0xc;
  auVar379._4_4_ = auVar395._4_4_ + 0x800 >> 0xc;
  auVar379._8_4_ = auVar395._8_4_ + 0x800 >> 0xc;
  auVar379._12_4_ = auVar395._12_4_ + 0x800 >> 0xc;
  auVar65 = packssdw(auVar64,auVar379);
  auVar420._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar420._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar420._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar420._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar299._0_4_ = auVar254._0_4_ + 0x800 >> 0xc;
  auVar299._4_4_ = auVar254._4_4_ + 0x800 >> 0xc;
  auVar299._8_4_ = auVar254._8_4_ + 0x800 >> 0xc;
  auVar299._12_4_ = auVar254._12_4_ + 0x800 >> 0xc;
  auVar421 = packssdw(auVar420,auVar299);
  local_488 = auVar3._0_2_;
  uStack_486 = auVar3._2_2_;
  uStack_484 = auVar3._4_2_;
  uStack_482 = auVar3._6_2_;
  uStack_480 = auVar3._8_2_;
  uStack_47e = auVar3._10_2_;
  uStack_47c = auVar3._12_2_;
  uStack_47a = auVar3._14_2_;
  auVar358._0_12_ = auVar105._0_12_;
  auVar358._12_2_ = auVar105._6_2_;
  auVar358._14_2_ = uStack_482;
  auVar357._12_4_ = auVar358._12_4_;
  auVar357._0_10_ = auVar105._0_10_;
  auVar357._10_2_ = uStack_484;
  auVar356._10_6_ = auVar357._10_6_;
  auVar356._0_8_ = auVar105._0_8_;
  auVar356._8_2_ = auVar105._4_2_;
  auVar355._8_8_ = auVar356._8_8_;
  auVar355._6_2_ = uStack_486;
  auVar355._4_2_ = auVar105._2_2_;
  auVar355._0_2_ = auVar105._0_2_;
  auVar355._2_2_ = local_488;
  auVar485._2_2_ = uStack_480;
  auVar485._0_2_ = auVar105._8_2_;
  auVar485._4_2_ = auVar105._10_2_;
  auVar485._6_2_ = uStack_47e;
  auVar485._8_2_ = auVar105._12_2_;
  auVar485._10_2_ = uStack_47c;
  auVar485._12_2_ = auVar105._14_2_;
  auVar485._14_2_ = uStack_47a;
  auVar300._8_4_ = 0xfb5bf0b0;
  auVar300._0_8_ = 0xfb5bf0b0fb5bf0b0;
  auVar300._12_4_ = 0xfb5bf0b0;
  auVar396 = pmaddwd(auVar355,auVar300);
  auVar395 = pmaddwd(auVar300,auVar485);
  auVar452 = pmaddwd(auVar355,auVar331);
  auVar254 = pmaddwd(auVar485,auVar331);
  auVar105._0_4_ = auVar396._0_4_ + 0x800 >> 0xc;
  auVar105._4_4_ = auVar396._4_4_ + 0x800 >> 0xc;
  auVar105._8_4_ = auVar396._8_4_ + 0x800 >> 0xc;
  auVar105._12_4_ = auVar396._12_4_ + 0x800 >> 0xc;
  auVar301._0_4_ = auVar395._0_4_ + 0x800 >> 0xc;
  auVar301._4_4_ = auVar395._4_4_ + 0x800 >> 0xc;
  auVar301._8_4_ = auVar395._8_4_ + 0x800 >> 0xc;
  auVar301._12_4_ = auVar395._12_4_ + 0x800 >> 0xc;
  auVar396 = packssdw(auVar105,auVar301);
  auVar359._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar359._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar359._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar359._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar486._0_4_ = auVar254._0_4_ + 0x800 >> 0xc;
  auVar486._4_4_ = auVar254._4_4_ + 0x800 >> 0xc;
  auVar486._8_4_ = auVar254._8_4_ + 0x800 >> 0xc;
  auVar486._12_4_ = auVar254._12_4_ + 0x800 >> 0xc;
  auVar360 = packssdw(auVar359,auVar486);
  auVar254 = pshuflw(ZEXT416(0x18f8),ZEXT416(0x18f8),0);
  uVar1 = auVar254._0_4_;
  auVar163._4_4_ = uVar1;
  auVar163._0_4_ = uVar1;
  auVar163._8_4_ = uVar1;
  auVar163._12_4_ = uVar1;
  auVar254 = pshuflw(ZEXT416(0x7d88),ZEXT416(0x7d88),0);
  uVar1 = auVar254._0_4_;
  auVar215._4_4_ = uVar1;
  auVar215._0_4_ = uVar1;
  auVar215._8_4_ = uVar1;
  auVar215._12_4_ = uVar1;
  auVar164 = pmulhrsw(auVar163,(undefined1  [16])input[8]);
  auVar254 = pmulhrsw(auVar215,(undefined1  [16])input[8]);
  local_328 = auVar107._0_2_;
  uStack_326 = auVar107._2_2_;
  uStack_324 = auVar107._4_2_;
  uStack_322 = auVar107._6_2_;
  uStack_320 = auVar107._8_2_;
  uStack_31e = auVar107._10_2_;
  uStack_31c = auVar107._12_2_;
  uStack_31a = auVar107._14_2_;
  auVar168._0_12_ = auVar4._0_12_;
  auVar168._12_2_ = auVar4._6_2_;
  auVar168._14_2_ = uStack_322;
  auVar167._12_4_ = auVar168._12_4_;
  auVar167._0_10_ = auVar4._0_10_;
  auVar167._10_2_ = uStack_324;
  auVar166._10_6_ = auVar167._10_6_;
  auVar166._0_8_ = auVar4._0_8_;
  auVar166._8_2_ = auVar4._4_2_;
  auVar165._8_8_ = auVar166._8_8_;
  auVar165._6_2_ = uStack_326;
  auVar165._4_2_ = auVar4._2_2_;
  auVar165._0_2_ = auVar4._0_2_;
  auVar165._2_2_ = local_328;
  auVar487._2_2_ = uStack_320;
  auVar487._0_2_ = auVar4._8_2_;
  auVar487._4_2_ = auVar4._10_2_;
  auVar487._6_2_ = uStack_31e;
  auVar487._8_2_ = auVar4._12_2_;
  auVar487._10_2_ = uStack_31c;
  auVar487._12_2_ = auVar4._14_2_;
  auVar487._14_2_ = uStack_31a;
  auVar415._8_4_ = 0x31ff04f;
  auVar415._0_8_ = 0x31ff04f031ff04f;
  auVar415._12_4_ = 0x31ff04f;
  auVar452 = pmaddwd(auVar165,auVar415);
  auVar395 = pmaddwd(auVar487,auVar415);
  auVar332._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar332._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar332._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar332._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar302._0_4_ = auVar395._0_4_ + 0x800 >> 0xc;
  auVar302._4_4_ = auVar395._4_4_ + 0x800 >> 0xc;
  auVar302._8_4_ = auVar395._8_4_ + 0x800 >> 0xc;
  auVar302._12_4_ = auVar395._12_4_ + 0x800 >> 0xc;
  auVar333 = packssdw(auVar332,auVar302);
  auVar303._8_4_ = 0xfb1031f;
  auVar303._0_8_ = 0xfb1031f0fb1031f;
  auVar303._12_4_ = 0xfb1031f;
  auVar452 = pmaddwd(auVar165,auVar303);
  auVar395 = pmaddwd(auVar487,auVar303);
  auVar169._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar169._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar169._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar169._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar488._0_4_ = auVar395._0_4_ + 0x800 >> 0xc;
  auVar488._4_4_ = auVar395._4_4_ + 0x800 >> 0xc;
  auVar488._8_4_ = auVar395._8_4_ + 0x800 >> 0xc;
  auVar488._12_4_ = auVar395._12_4_ + 0x800 >> 0xc;
  auVar105 = packssdw(auVar169,auVar488);
  auVar215 = paddsw(auVar4,auVar5);
  auVar481 = psubsw(auVar4,auVar5);
  local_308 = auVar109._0_2_;
  uStack_306 = auVar109._2_2_;
  uStack_304 = auVar109._4_2_;
  uStack_302 = auVar109._6_2_;
  uStack_300 = auVar109._8_2_;
  uStack_2fe = auVar109._10_2_;
  uStack_2fc = auVar109._12_2_;
  uStack_2fa = auVar109._14_2_;
  auVar383._0_12_ = auVar5._0_12_;
  auVar383._12_2_ = auVar5._6_2_;
  auVar383._14_2_ = uStack_302;
  auVar382._12_4_ = auVar383._12_4_;
  auVar382._0_10_ = auVar5._0_10_;
  auVar382._10_2_ = uStack_304;
  auVar381._10_6_ = auVar382._10_6_;
  auVar381._0_8_ = auVar5._0_8_;
  auVar381._8_2_ = auVar5._4_2_;
  auVar380._8_8_ = auVar381._8_8_;
  auVar380._6_2_ = uStack_306;
  auVar380._4_2_ = auVar5._2_2_;
  auVar380._0_2_ = auVar5._0_2_;
  auVar380._2_2_ = local_308;
  auVar334._2_2_ = uStack_300;
  auVar334._0_2_ = auVar5._8_2_;
  auVar334._4_2_ = auVar5._10_2_;
  auVar334._6_2_ = uStack_2fe;
  auVar334._8_2_ = auVar5._12_2_;
  auVar334._10_2_ = uStack_2fc;
  auVar334._12_2_ = auVar5._14_2_;
  auVar334._14_2_ = uStack_2fa;
  auVar304._8_4_ = 0xf04ffce1;
  auVar304._0_8_ = 0xf04ffce1f04ffce1;
  auVar304._12_4_ = 0xf04ffce1;
  auVar4 = pmaddwd(auVar380,auVar304);
  auVar5 = pmaddwd(auVar334,auVar304);
  auVar491._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar491._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar491._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar491._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar170._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar170._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar170._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar170._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar354 = packssdw(auVar491,auVar170);
  auVar5 = pmaddwd(auVar380,auVar415);
  auVar4 = pmaddwd(auVar334,auVar415);
  auVar384._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar384._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar384._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar384._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar335._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar335._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar335._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar335._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar385 = packssdw(auVar384,auVar335);
  auVar305 = psubsw(auVar162,auVar160);
  auVar171 = paddsw(auVar162,auVar160);
  local_318 = auVar111._0_2_;
  uStack_316 = auVar111._2_2_;
  uStack_314 = auVar111._4_2_;
  uStack_312 = auVar111._6_2_;
  uStack_310 = auVar111._8_2_;
  uStack_30e = auVar111._10_2_;
  uStack_30c = auVar111._12_2_;
  uStack_30a = auVar111._14_2_;
  auVar175._0_12_ = auVar160._0_12_;
  auVar175._12_2_ = auVar160._6_2_;
  auVar175._14_2_ = uStack_312;
  auVar174._12_4_ = auVar175._12_4_;
  auVar174._0_10_ = auVar160._0_10_;
  auVar174._10_2_ = uStack_314;
  auVar173._10_6_ = auVar174._10_6_;
  auVar173._0_8_ = auVar160._0_8_;
  auVar173._8_2_ = auVar160._4_2_;
  auVar172._8_8_ = auVar173._8_8_;
  auVar172._6_2_ = uStack_316;
  auVar172._4_2_ = auVar160._2_2_;
  auVar172._0_2_ = auVar160._0_2_;
  auVar172._2_2_ = local_318;
  auVar386._2_2_ = uStack_310;
  auVar386._0_2_ = auVar160._8_2_;
  auVar386._4_2_ = auVar160._10_2_;
  auVar386._6_2_ = uStack_30e;
  auVar386._8_2_ = auVar160._12_2_;
  auVar386._10_2_ = uStack_30c;
  auVar386._12_2_ = auVar160._14_2_;
  auVar386._14_2_ = uStack_30a;
  auVar266._8_4_ = 0xd4ef71c;
  auVar266._0_8_ = 0xd4ef71c0d4ef71c;
  auVar266._12_4_ = 0xd4ef71c;
  auVar5 = pmaddwd(auVar172,auVar266);
  auVar4 = pmaddwd(auVar386,auVar266);
  auVar482._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar482._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar482._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar482._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar361._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar361._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar361._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar361._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar483 = packssdw(auVar482,auVar361);
  auVar160._8_4_ = 0x8e40d4e;
  auVar160._0_8_ = 0x8e40d4e08e40d4e;
  auVar160._12_4_ = 0x8e40d4e;
  auVar4 = pmaddwd(auVar172,auVar160);
  auVar5 = pmaddwd(auVar386,auVar160);
  auVar176._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar176._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar176._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar176._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar387._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar387._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar387._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar387._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar177 = packssdw(auVar176,auVar387);
  local_348 = auVar113._0_2_;
  uStack_346 = auVar113._2_2_;
  uStack_344 = auVar113._4_2_;
  uStack_342 = auVar113._6_2_;
  uStack_340 = auVar113._8_2_;
  uStack_33e = auVar113._10_2_;
  uStack_33c = auVar113._12_2_;
  uStack_33a = auVar113._14_2_;
  auVar309._0_12_ = auVar162._0_12_;
  auVar309._12_2_ = auVar162._6_2_;
  auVar309._14_2_ = uStack_342;
  auVar308._12_4_ = auVar309._12_4_;
  auVar308._0_10_ = auVar162._0_10_;
  auVar308._10_2_ = uStack_344;
  auVar307._10_6_ = auVar308._10_6_;
  auVar307._0_8_ = auVar162._0_8_;
  auVar307._8_2_ = auVar162._4_2_;
  auVar306._8_8_ = auVar307._8_8_;
  auVar306._6_2_ = uStack_346;
  auVar306._4_2_ = auVar162._2_2_;
  auVar306._0_2_ = auVar162._0_2_;
  auVar306._2_2_ = local_348;
  auVar336._2_2_ = uStack_340;
  auVar336._0_2_ = auVar162._8_2_;
  auVar336._4_2_ = auVar162._10_2_;
  auVar336._6_2_ = uStack_33e;
  auVar336._8_2_ = auVar162._12_2_;
  auVar336._10_2_ = uStack_33c;
  auVar336._12_2_ = auVar162._14_2_;
  auVar336._14_2_ = uStack_33a;
  auVar388._8_4_ = 0xf71cf2b2;
  auVar388._0_8_ = 0xf71cf2b2f71cf2b2;
  auVar388._12_4_ = 0xf71cf2b2;
  auVar4 = pmaddwd(auVar306,auVar388);
  auVar5 = pmaddwd(auVar336,auVar388);
  auVar162._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar162._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar162._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar162._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar362._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar362._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar362._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar362._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar162,auVar362);
  auVar5 = pmaddwd(auVar306,auVar266);
  auVar395 = pmaddwd(auVar336,auVar266);
  auVar310._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar310._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar310._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar310._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar337._0_4_ = auVar395._0_4_ + 0x800 >> 0xc;
  auVar337._4_4_ = auVar395._4_4_ + 0x800 >> 0xc;
  auVar337._8_4_ = auVar395._8_4_ + 0x800 >> 0xc;
  auVar337._12_4_ = auVar395._12_4_ + 0x800 >> 0xc;
  auVar311 = packssdw(auVar310,auVar337);
  auVar5 = paddsw(auVar398,auVar256);
  auVar398 = psubsw(auVar398,auVar256);
  auVar363 = psubsw(auVar294,auVar454);
  auVar395 = paddsw(auVar294,auVar454);
  auVar452 = paddsw(auVar400,auVar217);
  auVar401 = psubsw(auVar400,auVar217);
  auVar312 = psubsw(auVar396,auVar65);
  auVar396 = paddsw(auVar396,auVar65);
  auVar65 = paddsw(auVar3,auVar103);
  auVar454 = psubsw(auVar3,auVar103);
  auVar103 = paddsw(auVar360,auVar421);
  auVar421 = psubsw(auVar360,auVar421);
  auVar66 = psubsw(auVar480,auVar213);
  auVar213 = paddsw(auVar213,auVar480);
  auVar400 = psubsw(auVar437,auVar54);
  auVar3 = paddsw(auVar54,auVar437);
  auVar217 = paddsw(auVar431,auVar378);
  auVar256 = psubsw(auVar431,auVar378);
  auVar54 = paddsw(auVar62,auVar129);
  auVar360 = psubsw(auVar62,auVar129);
  auVar294 = psubsw(auVar450,auVar329);
  auVar67 = paddsw(auVar329,auVar450);
  auVar62 = psubsw(auVar6,auVar2);
  auVar218 = paddsw(auVar2,auVar6);
  local_358 = auVar250._0_2_;
  uStack_356 = auVar250._2_2_;
  uStack_354 = auVar250._4_2_;
  uStack_352 = auVar250._6_2_;
  uStack_350 = auVar250._8_2_;
  uStack_34e = auVar250._10_2_;
  uStack_34c = auVar250._12_2_;
  uStack_34a = auVar250._14_2_;
  auVar270._0_12_ = auVar115._0_12_;
  auVar270._12_2_ = auVar115._6_2_;
  auVar270._14_2_ = uStack_352;
  auVar269._12_4_ = auVar270._12_4_;
  auVar269._0_10_ = auVar115._0_10_;
  auVar269._10_2_ = uStack_354;
  auVar268._10_6_ = auVar269._10_6_;
  auVar268._0_8_ = auVar115._0_8_;
  auVar268._8_2_ = auVar115._4_2_;
  auVar267._8_8_ = auVar268._8_8_;
  auVar267._6_2_ = uStack_356;
  auVar267._4_2_ = auVar115._2_2_;
  auVar267._0_2_ = auVar115._0_2_;
  auVar267._2_2_ = local_358;
  auVar219._2_2_ = uStack_350;
  auVar219._0_2_ = auVar115._8_2_;
  auVar219._4_2_ = auVar115._10_2_;
  auVar219._6_2_ = uStack_34e;
  auVar219._8_2_ = auVar115._12_2_;
  auVar219._10_2_ = uStack_34c;
  auVar219._12_2_ = auVar115._14_2_;
  auVar219._14_2_ = uStack_34a;
  auVar455._8_4_ = 0x61ff138;
  auVar455._0_8_ = 0x61ff138061ff138;
  auVar455._12_4_ = 0x61ff138;
  auVar6 = pmaddwd(auVar267,auVar455);
  auVar2 = pmaddwd(auVar219,auVar455);
  auVar130._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar130._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar130._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar130._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar338._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar338._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar338._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar338._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar131 = packssdw(auVar130,auVar338);
  auVar132._8_4_ = 0xec8061f;
  auVar132._0_8_ = 0xec8061f0ec8061f;
  auVar132._12_4_ = 0xec8061f;
  auVar2 = pmaddwd(auVar267,auVar132);
  auVar6 = pmaddwd(auVar219,auVar132);
  auVar271._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar271._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar271._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar271._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar220._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar220._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar220._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar220._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar272 = packssdw(auVar271,auVar220);
  auVar133 = paddsw(auVar115,auVar117);
  auVar389 = psubsw(auVar115,auVar117);
  local_338 = auVar252._0_2_;
  uStack_336 = auVar252._2_2_;
  uStack_334 = auVar252._4_2_;
  uStack_332 = auVar252._6_2_;
  uStack_330 = auVar252._8_2_;
  uStack_32e = auVar252._10_2_;
  uStack_32c = auVar252._12_2_;
  uStack_32a = auVar252._14_2_;
  auVar137._0_12_ = auVar117._0_12_;
  auVar137._12_2_ = auVar117._6_2_;
  auVar137._14_2_ = uStack_332;
  auVar136._12_4_ = auVar137._12_4_;
  auVar136._0_10_ = auVar117._0_10_;
  auVar136._10_2_ = uStack_334;
  auVar135._10_6_ = auVar136._10_6_;
  auVar135._0_8_ = auVar117._0_8_;
  auVar135._8_2_ = auVar117._4_2_;
  auVar134._8_8_ = auVar135._8_8_;
  auVar134._6_2_ = uStack_336;
  auVar134._4_2_ = auVar117._2_2_;
  auVar134._0_2_ = auVar117._0_2_;
  auVar134._2_2_ = local_338;
  auVar221._2_2_ = uStack_330;
  auVar221._0_2_ = auVar117._8_2_;
  auVar221._4_2_ = auVar117._10_2_;
  auVar221._6_2_ = uStack_32e;
  auVar221._8_2_ = auVar117._12_2_;
  auVar221._10_2_ = uStack_32c;
  auVar221._12_2_ = auVar117._14_2_;
  auVar221._14_2_ = uStack_32a;
  auVar115._8_4_ = 0xf138f9e1;
  auVar115._0_8_ = 0xf138f9e1f138f9e1;
  auVar115._12_4_ = 0xf138f9e1;
  auVar6 = pmaddwd(auVar134,auVar115);
  auVar2 = pmaddwd(auVar221,auVar115);
  auVar8._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar8._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar8._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar8._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar339._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar339._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar339._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar339._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar162 = packssdw(auVar8,auVar339);
  auVar6 = pmaddwd(auVar134,auVar455);
  auVar2 = pmaddwd(auVar221,auVar455);
  auVar138._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar138._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar138._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar138._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar222._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar222._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar222._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar222._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar139 = packssdw(auVar138,auVar222);
  auVar140 = paddsw(auVar333,auVar354);
  auVar431 = psubsw(auVar333,auVar354);
  auVar456 = psubsw(auVar4,auVar483);
  auVar437 = paddsw(auVar4,auVar483);
  auVar450 = paddsw(auVar113,auVar111);
  auVar4 = psubsw(auVar113,auVar111);
  auVar480 = paddsw(auVar311,auVar177);
  auVar6 = psubsw(auVar311,auVar177);
  auVar2 = psubsw(auVar107,auVar109);
  auVar483 = paddsw(auVar109,auVar107);
  auVar223 = psubsw(auVar105,auVar385);
  auVar9 = paddsw(auVar385,auVar105);
  auVar113._0_12_ = auVar398._0_12_;
  auVar113._12_2_ = auVar398._6_2_;
  auVar113._14_2_ = auVar62._6_2_;
  auVar111._12_4_ = auVar113._12_4_;
  auVar111._0_10_ = auVar398._0_10_;
  auVar111._10_2_ = auVar62._4_2_;
  auVar109._10_6_ = auVar111._10_6_;
  auVar109._0_8_ = auVar398._0_8_;
  auVar109._8_2_ = auVar398._4_2_;
  auVar107._8_8_ = auVar109._8_8_;
  auVar107._6_2_ = auVar62._2_2_;
  auVar107._4_2_ = auVar398._2_2_;
  auVar107._0_2_ = auVar398._0_2_;
  auVar107._2_2_ = auVar62._0_2_;
  auVar178._2_2_ = auVar62._8_2_;
  auVar178._0_2_ = auVar398._8_2_;
  auVar178._4_2_ = auVar398._10_2_;
  auVar178._6_2_ = auVar62._10_2_;
  auVar178._8_2_ = auVar398._12_2_;
  auVar178._10_2_ = auVar62._12_2_;
  auVar178._12_2_ = auVar398._14_2_;
  auVar178._14_2_ = auVar62._14_2_;
  auVar62 = pmaddwd(auVar107,auVar415);
  auVar354 = pmaddwd(auVar178,auVar415);
  auVar141._0_4_ = auVar62._0_4_ + 0x800 >> 0xc;
  auVar141._4_4_ = auVar62._4_4_ + 0x800 >> 0xc;
  auVar141._8_4_ = auVar62._8_4_ + 0x800 >> 0xc;
  auVar141._12_4_ = auVar62._12_4_ + 0x800 >> 0xc;
  auVar10._0_4_ = auVar354._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar354._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar354._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar354._12_4_ + 0x800 >> 0xc;
  auVar142 = packssdw(auVar141,auVar10);
  auVar354 = pmaddwd(auVar107,auVar303);
  auVar62 = pmaddwd(auVar178,auVar303);
  auVar117._0_4_ = auVar354._0_4_ + 0x800 >> 0xc;
  auVar117._4_4_ = auVar354._4_4_ + 0x800 >> 0xc;
  auVar117._8_4_ = auVar354._8_4_ + 0x800 >> 0xc;
  auVar117._12_4_ = auVar354._12_4_ + 0x800 >> 0xc;
  auVar179._0_4_ = auVar62._0_4_ + 0x800 >> 0xc;
  auVar179._4_4_ = auVar62._4_4_ + 0x800 >> 0xc;
  auVar179._8_4_ = auVar62._8_4_ + 0x800 >> 0xc;
  auVar179._12_4_ = auVar62._12_4_ + 0x800 >> 0xc;
  auVar354 = packssdw(auVar117,auVar179);
  auVar14._0_12_ = auVar451._0_12_;
  auVar14._12_2_ = auVar451._6_2_;
  auVar14._14_2_ = auVar294._6_2_;
  auVar13._12_4_ = auVar14._12_4_;
  auVar13._0_10_ = auVar451._0_10_;
  auVar13._10_2_ = auVar294._4_2_;
  auVar12._10_6_ = auVar13._10_6_;
  auVar12._0_8_ = auVar451._0_8_;
  auVar12._8_2_ = auVar451._4_2_;
  auVar11._8_8_ = auVar12._8_8_;
  auVar11._6_2_ = auVar294._2_2_;
  auVar11._4_2_ = auVar451._2_2_;
  auVar11._0_2_ = auVar451._0_2_;
  auVar11._2_2_ = auVar294._0_2_;
  auVar129._2_2_ = auVar294._8_2_;
  auVar129._0_2_ = auVar451._8_2_;
  auVar129._4_2_ = auVar451._10_2_;
  auVar129._6_2_ = auVar294._10_2_;
  auVar129._8_2_ = auVar451._12_2_;
  auVar129._10_2_ = auVar294._12_2_;
  auVar129._12_2_ = auVar451._14_2_;
  auVar129._14_2_ = auVar294._14_2_;
  auVar105 = pmaddwd(auVar11,auVar303);
  auVar62 = pmaddwd(auVar129,auVar303);
  auVar107 = pmaddwd(auVar11,auVar415);
  auVar109 = pmaddwd(auVar129,auVar415);
  auVar180._0_4_ = auVar107._0_4_ + 0x800 >> 0xc;
  auVar180._4_4_ = auVar107._4_4_ + 0x800 >> 0xc;
  auVar180._8_4_ = auVar107._8_4_ + 0x800 >> 0xc;
  auVar180._12_4_ = auVar107._12_4_ + 0x800 >> 0xc;
  auVar422._0_4_ = auVar109._0_4_ + 0x800 >> 0xc;
  auVar422._4_4_ = auVar109._4_4_ + 0x800 >> 0xc;
  auVar422._8_4_ = auVar109._8_4_ + 0x800 >> 0xc;
  auVar422._12_4_ = auVar109._12_4_ + 0x800 >> 0xc;
  auVar451 = packssdw(auVar180,auVar422);
  auVar15._0_4_ = auVar105._0_4_ + 0x800 >> 0xc;
  auVar15._4_4_ = auVar105._4_4_ + 0x800 >> 0xc;
  auVar15._8_4_ = auVar105._8_4_ + 0x800 >> 0xc;
  auVar15._12_4_ = auVar105._12_4_ + 0x800 >> 0xc;
  auVar177._0_4_ = auVar62._0_4_ + 0x800 >> 0xc;
  auVar177._4_4_ = auVar62._4_4_ + 0x800 >> 0xc;
  auVar177._8_4_ = auVar62._8_4_ + 0x800 >> 0xc;
  auVar177._12_4_ = auVar62._12_4_ + 0x800 >> 0xc;
  auVar107 = packssdw(auVar15,auVar177);
  local_468 = auVar256._0_2_;
  uStack_466 = auVar256._2_2_;
  uStack_464 = auVar256._4_2_;
  uStack_462 = auVar256._6_2_;
  uStack_460 = auVar256._8_2_;
  uStack_45e = auVar256._10_2_;
  uStack_45c = auVar256._12_2_;
  uStack_45a = auVar256._14_2_;
  auVar19._0_12_ = auVar119._0_12_;
  auVar19._12_2_ = auVar119._6_2_;
  auVar19._14_2_ = uStack_462;
  auVar18._12_4_ = auVar19._12_4_;
  auVar18._0_10_ = auVar119._0_10_;
  auVar18._10_2_ = uStack_464;
  auVar17._10_6_ = auVar18._10_6_;
  auVar17._0_8_ = auVar119._0_8_;
  auVar17._8_2_ = auVar119._4_2_;
  auVar16._8_8_ = auVar17._8_8_;
  auVar16._6_2_ = uStack_466;
  auVar16._4_2_ = auVar119._2_2_;
  auVar16._0_2_ = auVar119._0_2_;
  auVar16._2_2_ = local_468;
  auVar143._2_2_ = uStack_460;
  auVar143._0_2_ = auVar119._8_2_;
  auVar143._4_2_ = auVar119._10_2_;
  auVar143._6_2_ = uStack_45e;
  auVar143._8_2_ = auVar119._12_2_;
  auVar143._10_2_ = uStack_45c;
  auVar143._12_2_ = auVar119._14_2_;
  auVar143._14_2_ = uStack_45a;
  auVar62 = pmaddwd(auVar16,auVar304);
  auVar119 = pmaddwd(auVar143,auVar304);
  auVar273._0_4_ = auVar62._0_4_ + 0x800 >> 0xc;
  auVar273._4_4_ = auVar62._4_4_ + 0x800 >> 0xc;
  auVar273._8_4_ = auVar62._8_4_ + 0x800 >> 0xc;
  auVar273._12_4_ = auVar62._12_4_ + 0x800 >> 0xc;
  auVar256._0_4_ = auVar119._0_4_ + 0x800 >> 0xc;
  auVar256._4_4_ = auVar119._4_4_ + 0x800 >> 0xc;
  auVar256._8_4_ = auVar119._8_4_ + 0x800 >> 0xc;
  auVar256._12_4_ = auVar119._12_4_ + 0x800 >> 0xc;
  auVar274 = packssdw(auVar273,auVar256);
  auVar119 = pmaddwd(auVar16,auVar415);
  auVar62 = pmaddwd(auVar143,auVar415);
  auVar20._0_4_ = auVar119._0_4_ + 0x800 >> 0xc;
  auVar20._4_4_ = auVar119._4_4_ + 0x800 >> 0xc;
  auVar20._8_4_ = auVar119._8_4_ + 0x800 >> 0xc;
  auVar20._12_4_ = auVar119._12_4_ + 0x800 >> 0xc;
  auVar144._0_4_ = auVar62._0_4_ + 0x800 >> 0xc;
  auVar144._4_4_ = auVar62._4_4_ + 0x800 >> 0xc;
  auVar144._8_4_ = auVar62._8_4_ + 0x800 >> 0xc;
  auVar144._12_4_ = auVar62._12_4_ + 0x800 >> 0xc;
  auVar109 = packssdw(auVar20,auVar144);
  local_458 = auVar360._0_2_;
  uStack_456 = auVar360._2_2_;
  uStack_454 = auVar360._4_2_;
  uStack_452 = auVar360._6_2_;
  uStack_450 = auVar360._8_2_;
  uStack_44e = auVar360._10_2_;
  uStack_44c = auVar360._12_2_;
  uStack_44a = auVar360._14_2_;
  auVar311._0_12_ = auVar363._0_12_;
  auVar311._12_2_ = auVar363._6_2_;
  auVar311._14_2_ = uStack_452;
  auVar329._12_4_ = auVar311._12_4_;
  auVar329._0_10_ = auVar363._0_10_;
  auVar329._10_2_ = uStack_454;
  auVar398._10_6_ = auVar329._10_6_;
  auVar398._0_8_ = auVar363._0_8_;
  auVar398._8_2_ = auVar363._4_2_;
  auVar294._8_8_ = auVar398._8_8_;
  auVar294._6_2_ = uStack_456;
  auVar294._4_2_ = auVar363._2_2_;
  auVar294._0_2_ = auVar363._0_2_;
  auVar294._2_2_ = local_458;
  auVar364._2_2_ = uStack_450;
  auVar364._0_2_ = auVar363._8_2_;
  auVar364._4_2_ = auVar363._10_2_;
  auVar364._6_2_ = uStack_44e;
  auVar364._8_2_ = auVar363._12_2_;
  auVar364._10_2_ = uStack_44c;
  auVar364._12_2_ = auVar363._14_2_;
  auVar364._14_2_ = uStack_44a;
  auVar105 = pmaddwd(auVar294,auVar304);
  auVar62 = pmaddwd(auVar304,auVar364);
  auVar119 = pmaddwd(auVar294,auVar415);
  auVar360 = pmaddwd(auVar364,auVar415);
  auVar484._0_4_ = auVar105._0_4_ + 0x800 >> 0xc;
  auVar484._4_4_ = auVar105._4_4_ + 0x800 >> 0xc;
  auVar484._8_4_ = auVar105._8_4_ + 0x800 >> 0xc;
  auVar484._12_4_ = auVar105._12_4_ + 0x800 >> 0xc;
  auVar21._0_4_ = auVar62._0_4_ + 0x800 >> 0xc;
  auVar21._4_4_ = auVar62._4_4_ + 0x800 >> 0xc;
  auVar21._8_4_ = auVar62._8_4_ + 0x800 >> 0xc;
  auVar21._12_4_ = auVar62._12_4_ + 0x800 >> 0xc;
  auVar485 = packssdw(auVar484,auVar21);
  auVar333._0_4_ = auVar119._0_4_ + 0x800 >> 0xc;
  auVar333._4_4_ = auVar119._4_4_ + 0x800 >> 0xc;
  auVar333._8_4_ = auVar119._8_4_ + 0x800 >> 0xc;
  auVar333._12_4_ = auVar119._12_4_ + 0x800 >> 0xc;
  auVar365._0_4_ = auVar360._0_4_ + 0x800 >> 0xc;
  auVar365._4_4_ = auVar360._4_4_ + 0x800 >> 0xc;
  auVar365._8_4_ = auVar360._8_4_ + 0x800 >> 0xc;
  auVar365._12_4_ = auVar360._12_4_ + 0x800 >> 0xc;
  auVar119 = packssdw(auVar333,auVar365);
  local_3f8 = auVar400._0_2_;
  uStack_3f6 = auVar400._2_2_;
  uStack_3f4 = auVar400._4_2_;
  uStack_3f2 = auVar400._6_2_;
  uStack_3f0 = auVar400._8_2_;
  uStack_3ee = auVar400._10_2_;
  uStack_3ec = auVar400._12_2_;
  uStack_3ea = auVar400._14_2_;
  auVar25._0_12_ = auVar401._0_12_;
  auVar25._12_2_ = auVar401._6_2_;
  auVar25._14_2_ = uStack_3f2;
  auVar24._12_4_ = auVar25._12_4_;
  auVar24._0_10_ = auVar401._0_10_;
  auVar24._10_2_ = uStack_3f4;
  auVar23._10_6_ = auVar24._10_6_;
  auVar23._0_8_ = auVar401._0_8_;
  auVar23._8_2_ = auVar401._4_2_;
  auVar22._8_8_ = auVar23._8_8_;
  auVar22._6_2_ = uStack_3f6;
  auVar22._4_2_ = auVar401._2_2_;
  auVar22._0_2_ = auVar401._0_2_;
  auVar22._2_2_ = local_3f8;
  auVar402._2_2_ = uStack_3f0;
  auVar402._0_2_ = auVar401._8_2_;
  auVar402._4_2_ = auVar401._10_2_;
  auVar402._6_2_ = uStack_3ee;
  auVar402._8_2_ = auVar401._12_2_;
  auVar402._10_2_ = uStack_3ec;
  auVar402._12_2_ = auVar401._14_2_;
  auVar402._14_2_ = uStack_3ea;
  auVar360 = pmaddwd(auVar22,auVar266);
  auVar62 = pmaddwd(auVar402,auVar266);
  auVar145._0_4_ = auVar360._0_4_ + 0x800 >> 0xc;
  auVar145._4_4_ = auVar360._4_4_ + 0x800 >> 0xc;
  auVar145._8_4_ = auVar360._8_4_ + 0x800 >> 0xc;
  auVar145._12_4_ = auVar360._12_4_ + 0x800 >> 0xc;
  auVar400._0_4_ = auVar62._0_4_ + 0x800 >> 0xc;
  auVar400._4_4_ = auVar62._4_4_ + 0x800 >> 0xc;
  auVar400._8_4_ = auVar62._8_4_ + 0x800 >> 0xc;
  auVar400._12_4_ = auVar62._12_4_ + 0x800 >> 0xc;
  auVar256 = packssdw(auVar145,auVar400);
  auVar62 = pmaddwd(auVar22,auVar160);
  auVar360 = pmaddwd(auVar402,auVar160);
  auVar26._0_4_ = auVar62._0_4_ + 0x800 >> 0xc;
  auVar26._4_4_ = auVar62._4_4_ + 0x800 >> 0xc;
  auVar26._8_4_ = auVar62._8_4_ + 0x800 >> 0xc;
  auVar26._12_4_ = auVar62._12_4_ + 0x800 >> 0xc;
  auVar403._0_4_ = auVar360._0_4_ + 0x800 >> 0xc;
  auVar403._4_4_ = auVar360._4_4_ + 0x800 >> 0xc;
  auVar403._8_4_ = auVar360._8_4_ + 0x800 >> 0xc;
  auVar403._12_4_ = auVar360._12_4_ + 0x800 >> 0xc;
  auVar415 = packssdw(auVar26,auVar403);
  local_408 = auVar66._0_2_;
  uStack_406 = auVar66._2_2_;
  uStack_404 = auVar66._4_2_;
  uStack_402 = auVar66._6_2_;
  uStack_400 = auVar66._8_2_;
  uStack_3fe = auVar66._10_2_;
  uStack_3fc = auVar66._12_2_;
  uStack_3fa = auVar66._14_2_;
  auVar184._0_12_ = auVar63._0_12_;
  auVar184._12_2_ = auVar63._6_2_;
  auVar184._14_2_ = uStack_402;
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._0_10_ = auVar63._0_10_;
  auVar183._10_2_ = uStack_404;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._0_8_ = auVar63._0_8_;
  auVar182._8_2_ = auVar63._4_2_;
  auVar181._8_8_ = auVar182._8_8_;
  auVar181._6_2_ = uStack_406;
  auVar181._4_2_ = auVar63._2_2_;
  auVar181._0_2_ = auVar63._0_2_;
  auVar181._2_2_ = local_408;
  auVar27._2_2_ = uStack_400;
  auVar27._0_2_ = auVar63._8_2_;
  auVar27._4_2_ = auVar63._10_2_;
  auVar27._6_2_ = uStack_3fe;
  auVar27._8_2_ = auVar63._12_2_;
  auVar27._10_2_ = uStack_3fc;
  auVar27._12_2_ = auVar63._14_2_;
  auVar27._14_2_ = uStack_3fa;
  auVar105 = pmaddwd(auVar181,auVar160);
  auVar360 = pmaddwd(auVar27,auVar160);
  auVar160 = pmaddwd(auVar181,auVar266);
  auVar62 = pmaddwd(auVar27,auVar266);
  auVar340._0_4_ = auVar160._0_4_ + 0x800 >> 0xc;
  auVar340._4_4_ = auVar160._4_4_ + 0x800 >> 0xc;
  auVar340._8_4_ = auVar160._8_4_ + 0x800 >> 0xc;
  auVar340._12_4_ = auVar160._12_4_ + 0x800 >> 0xc;
  auVar63._0_4_ = auVar62._0_4_ + 0x800 >> 0xc;
  auVar63._4_4_ = auVar62._4_4_ + 0x800 >> 0xc;
  auVar63._8_4_ = auVar62._8_4_ + 0x800 >> 0xc;
  auVar63._12_4_ = auVar62._12_4_ + 0x800 >> 0xc;
  auVar401 = packssdw(auVar340,auVar63);
  auVar185._0_4_ = auVar105._0_4_ + 0x800 >> 0xc;
  auVar185._4_4_ = auVar105._4_4_ + 0x800 >> 0xc;
  auVar185._8_4_ = auVar105._8_4_ + 0x800 >> 0xc;
  auVar185._12_4_ = auVar105._12_4_ + 0x800 >> 0xc;
  auVar28._0_4_ = auVar360._0_4_ + 0x800 >> 0xc;
  auVar28._4_4_ = auVar360._4_4_ + 0x800 >> 0xc;
  auVar28._8_4_ = auVar360._8_4_ + 0x800 >> 0xc;
  auVar28._12_4_ = auVar360._12_4_ + 0x800 >> 0xc;
  auVar398 = packssdw(auVar185,auVar28);
  local_488 = auVar454._0_2_;
  uStack_486 = auVar454._2_2_;
  uStack_484 = auVar454._4_2_;
  uStack_482 = auVar454._6_2_;
  uStack_480 = auVar454._8_2_;
  uStack_47e = auVar454._10_2_;
  uStack_47c = auVar454._12_2_;
  uStack_47a = auVar454._14_2_;
  auVar189._0_12_ = auVar290._0_12_;
  auVar189._12_2_ = auVar290._6_2_;
  auVar189._14_2_ = uStack_482;
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._0_10_ = auVar290._0_10_;
  auVar188._10_2_ = uStack_484;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._0_8_ = auVar290._0_8_;
  auVar187._8_2_ = auVar290._4_2_;
  auVar186._8_8_ = auVar187._8_8_;
  auVar186._6_2_ = uStack_486;
  auVar186._4_2_ = auVar290._2_2_;
  auVar186._0_2_ = auVar290._0_2_;
  auVar186._2_2_ = local_488;
  auVar146._2_2_ = uStack_480;
  auVar146._0_2_ = auVar290._8_2_;
  auVar146._4_2_ = auVar290._10_2_;
  auVar146._6_2_ = uStack_47e;
  auVar146._8_2_ = auVar290._12_2_;
  auVar146._10_2_ = uStack_47c;
  auVar146._12_2_ = auVar290._14_2_;
  auVar146._14_2_ = uStack_47a;
  auVar290 = pmaddwd(auVar186,auVar388);
  auVar62 = pmaddwd(auVar146,auVar388);
  auVar29._0_4_ = auVar290._0_4_ + 0x800 >> 0xc;
  auVar29._4_4_ = auVar290._4_4_ + 0x800 >> 0xc;
  auVar29._8_4_ = auVar290._8_4_ + 0x800 >> 0xc;
  auVar29._12_4_ = auVar290._12_4_ + 0x800 >> 0xc;
  auVar454._0_4_ = auVar62._0_4_ + 0x800 >> 0xc;
  auVar454._4_4_ = auVar62._4_4_ + 0x800 >> 0xc;
  auVar454._8_4_ = auVar62._8_4_ + 0x800 >> 0xc;
  auVar454._12_4_ = auVar62._12_4_ + 0x800 >> 0xc;
  auVar160 = packssdw(auVar29,auVar454);
  auVar290 = pmaddwd(auVar186,auVar266);
  auVar62 = pmaddwd(auVar146,auVar266);
  auVar190._0_4_ = auVar290._0_4_ + 0x800 >> 0xc;
  auVar190._4_4_ = auVar290._4_4_ + 0x800 >> 0xc;
  auVar190._8_4_ = auVar290._8_4_ + 0x800 >> 0xc;
  auVar190._12_4_ = auVar290._12_4_ + 0x800 >> 0xc;
  auVar147._0_4_ = auVar62._0_4_ + 0x800 >> 0xc;
  auVar147._4_4_ = auVar62._4_4_ + 0x800 >> 0xc;
  auVar147._8_4_ = auVar62._8_4_ + 0x800 >> 0xc;
  auVar147._12_4_ = auVar62._12_4_ + 0x800 >> 0xc;
  auVar311 = packssdw(auVar190,auVar147);
  local_448 = auVar421._0_2_;
  uStack_446 = auVar421._2_2_;
  uStack_444 = auVar421._4_2_;
  uStack_442 = auVar421._6_2_;
  uStack_440 = auVar421._8_2_;
  uStack_43e = auVar421._10_2_;
  uStack_43c = auVar421._12_2_;
  uStack_43a = auVar421._14_2_;
  auVar33._0_12_ = auVar312._0_12_;
  auVar33._12_2_ = auVar312._6_2_;
  auVar33._14_2_ = uStack_442;
  auVar32._12_4_ = auVar33._12_4_;
  auVar32._0_10_ = auVar312._0_10_;
  auVar32._10_2_ = uStack_444;
  auVar31._10_6_ = auVar32._10_6_;
  auVar31._0_8_ = auVar312._0_8_;
  auVar31._8_2_ = auVar312._4_2_;
  auVar30._8_8_ = auVar31._8_8_;
  auVar30._6_2_ = uStack_446;
  auVar30._4_2_ = auVar312._2_2_;
  auVar30._0_2_ = auVar312._0_2_;
  auVar30._2_2_ = local_448;
  auVar313._2_2_ = uStack_440;
  auVar313._0_2_ = auVar312._8_2_;
  auVar313._4_2_ = auVar312._10_2_;
  auVar313._6_2_ = uStack_43e;
  auVar313._8_2_ = auVar312._12_2_;
  auVar313._10_2_ = uStack_43c;
  auVar313._12_2_ = auVar312._14_2_;
  auVar313._14_2_ = uStack_43a;
  auVar62 = pmaddwd(auVar30,auVar388);
  auVar360 = pmaddwd(auVar388,auVar313);
  auVar290 = pmaddwd(auVar30,auVar266);
  auVar105 = pmaddwd(auVar313,auVar266);
  auVar421._0_4_ = auVar62._0_4_ + 0x800 >> 0xc;
  auVar421._4_4_ = auVar62._4_4_ + 0x800 >> 0xc;
  auVar421._8_4_ = auVar62._8_4_ + 0x800 >> 0xc;
  auVar421._12_4_ = auVar62._12_4_ + 0x800 >> 0xc;
  auVar148._0_4_ = auVar360._0_4_ + 0x800 >> 0xc;
  auVar148._4_4_ = auVar360._4_4_ + 0x800 >> 0xc;
  auVar148._8_4_ = auVar360._8_4_ + 0x800 >> 0xc;
  auVar148._12_4_ = auVar360._12_4_ + 0x800 >> 0xc;
  auVar62 = packssdw(auVar421,auVar148);
  auVar34._0_4_ = auVar290._0_4_ + 0x800 >> 0xc;
  auVar34._4_4_ = auVar290._4_4_ + 0x800 >> 0xc;
  auVar34._8_4_ = auVar290._8_4_ + 0x800 >> 0xc;
  auVar34._12_4_ = auVar290._12_4_ + 0x800 >> 0xc;
  auVar314._0_4_ = auVar105._0_4_ + 0x800 >> 0xc;
  auVar314._4_4_ = auVar105._4_4_ + 0x800 >> 0xc;
  auVar314._8_4_ = auVar105._8_4_ + 0x800 >> 0xc;
  auVar314._12_4_ = auVar105._12_4_ + 0x800 >> 0xc;
  auVar111 = packssdw(auVar34,auVar314);
  auVar290 = pshuflw(ZEXT416(0x5a80),ZEXT416(0x5a80),0);
  auVar66._0_4_ = auVar290._0_4_;
  auVar66._4_4_ = auVar66._0_4_;
  auVar66._8_4_ = auVar66._0_4_;
  auVar66._12_4_ = auVar66._0_4_;
  auVar290 = pmulhrsw(auVar66,(undefined1  [16])*input);
  auVar113 = paddsw(auVar290,auVar164);
  auVar360 = psubsw(auVar290,auVar164);
  local_368 = auVar254._0_2_;
  uStack_366 = auVar254._2_2_;
  uStack_364 = auVar254._4_2_;
  uStack_362 = auVar254._6_2_;
  uStack_360 = auVar254._8_2_;
  uStack_35e = auVar254._10_2_;
  uStack_35c = auVar254._12_2_;
  uStack_35a = auVar254._14_2_;
  auVar385._0_12_ = auVar164._0_12_;
  auVar385._12_2_ = auVar164._6_2_;
  auVar385._14_2_ = uStack_362;
  auVar378._12_4_ = auVar385._12_4_;
  auVar378._0_10_ = auVar164._0_10_;
  auVar378._10_2_ = uStack_364;
  auVar363._10_6_ = auVar378._10_6_;
  auVar363._0_8_ = auVar164._0_8_;
  auVar363._8_2_ = auVar164._4_2_;
  auVar312._8_8_ = auVar363._8_8_;
  auVar312._6_2_ = uStack_366;
  auVar312._4_2_ = auVar164._2_2_;
  auVar312._0_2_ = auVar164._0_2_;
  auVar312._2_2_ = local_368;
  auVar35._2_2_ = uStack_360;
  auVar35._0_2_ = auVar164._8_2_;
  auVar35._4_2_ = auVar164._10_2_;
  auVar35._6_2_ = uStack_35e;
  auVar35._8_2_ = auVar164._12_2_;
  auVar35._10_2_ = uStack_35c;
  auVar35._12_2_ = auVar164._14_2_;
  auVar35._14_2_ = uStack_35a;
  auVar275._8_4_ = 0xb50f4b0;
  auVar275._0_8_ = 0xb50f4b00b50f4b0;
  auVar275._12_4_ = 0xb50f4b0;
  auVar105 = pmaddwd(auVar312,auVar275);
  auVar117 = pmaddwd(auVar35,auVar275);
  auVar68._0_4_ = auVar105._0_4_ + 0x800 >> 0xc;
  auVar68._4_4_ = auVar105._4_4_ + 0x800 >> 0xc;
  auVar68._8_4_ = auVar105._8_4_ + 0x800 >> 0xc;
  auVar68._12_4_ = auVar105._12_4_ + 0x800 >> 0xc;
  auVar149._0_4_ = auVar117._0_4_ + 0x800 >> 0xc;
  auVar149._4_4_ = auVar117._4_4_ + 0x800 >> 0xc;
  auVar149._8_4_ = auVar117._8_4_ + 0x800 >> 0xc;
  auVar149._12_4_ = auVar117._12_4_ + 0x800 >> 0xc;
  auVar177 = packssdw(auVar68,auVar149);
  auVar150._8_4_ = 0xb500b50;
  auVar150._0_8_ = 0xb500b500b500b50;
  auVar150._12_4_ = 0xb500b50;
  auVar105 = pmaddwd(auVar312,auVar150);
  auVar117 = pmaddwd(auVar35,auVar150);
  auVar164._0_4_ = auVar105._0_4_ + 0x800 >> 0xc;
  auVar164._4_4_ = auVar105._4_4_ + 0x800 >> 0xc;
  auVar164._8_4_ = auVar105._8_4_ + 0x800 >> 0xc;
  auVar164._12_4_ = auVar105._12_4_ + 0x800 >> 0xc;
  auVar36._0_4_ = auVar117._0_4_ + 0x800 >> 0xc;
  auVar36._4_4_ = auVar117._4_4_ + 0x800 >> 0xc;
  auVar36._8_4_ = auVar117._8_4_ + 0x800 >> 0xc;
  auVar36._12_4_ = auVar117._12_4_ + 0x800 >> 0xc;
  auVar105 = packssdw(auVar164,auVar36);
  auVar294 = paddsw(auVar131,auVar162);
  auVar162 = psubsw(auVar131,auVar162);
  auVar329 = psubsw(auVar250,auVar252);
  auVar117 = paddsw(auVar252,auVar250);
  auVar378 = psubsw(auVar272,auVar139);
  auVar438 = paddsw(auVar139,auVar272);
  auVar318._0_12_ = auVar431._0_12_;
  auVar318._12_2_ = auVar431._6_2_;
  auVar318._14_2_ = auVar223._6_2_;
  auVar317._12_4_ = auVar318._12_4_;
  auVar317._0_10_ = auVar431._0_10_;
  auVar317._10_2_ = auVar223._4_2_;
  auVar316._10_6_ = auVar317._10_6_;
  auVar316._0_8_ = auVar431._0_8_;
  auVar316._8_2_ = auVar431._4_2_;
  auVar315._8_8_ = auVar316._8_8_;
  auVar315._6_2_ = auVar223._2_2_;
  auVar315._4_2_ = auVar431._2_2_;
  auVar315._0_2_ = auVar431._0_2_;
  auVar315._2_2_ = auVar223._0_2_;
  auVar151._2_2_ = auVar223._8_2_;
  auVar151._0_2_ = auVar431._8_2_;
  auVar151._4_2_ = auVar431._10_2_;
  auVar151._6_2_ = auVar223._10_2_;
  auVar151._8_2_ = auVar431._12_2_;
  auVar151._10_2_ = auVar223._12_2_;
  auVar151._12_2_ = auVar431._14_2_;
  auVar151._14_2_ = auVar223._14_2_;
  auVar333 = pmaddwd(auVar315,auVar455);
  auVar129 = pmaddwd(auVar151,auVar455);
  auVar191._0_4_ = auVar333._0_4_ + 0x800 >> 0xc;
  auVar191._4_4_ = auVar333._4_4_ + 0x800 >> 0xc;
  auVar191._8_4_ = auVar333._8_4_ + 0x800 >> 0xc;
  auVar191._12_4_ = auVar333._12_4_ + 0x800 >> 0xc;
  auVar37._0_4_ = auVar129._0_4_ + 0x800 >> 0xc;
  auVar37._4_4_ = auVar129._4_4_ + 0x800 >> 0xc;
  auVar37._8_4_ = auVar129._8_4_ + 0x800 >> 0xc;
  auVar37._12_4_ = auVar129._12_4_ + 0x800 >> 0xc;
  auVar333 = packssdw(auVar191,auVar37);
  auVar400 = pmaddwd(auVar315,auVar132);
  auVar129 = pmaddwd(auVar151,auVar132);
  auVar319._0_4_ = auVar400._0_4_ + 0x800 >> 0xc;
  auVar319._4_4_ = auVar400._4_4_ + 0x800 >> 0xc;
  auVar319._8_4_ = auVar400._8_4_ + 0x800 >> 0xc;
  auVar319._12_4_ = auVar400._12_4_ + 0x800 >> 0xc;
  auVar152._0_4_ = auVar129._0_4_ + 0x800 >> 0xc;
  auVar152._4_4_ = auVar129._4_4_ + 0x800 >> 0xc;
  auVar152._8_4_ = auVar129._8_4_ + 0x800 >> 0xc;
  auVar152._12_4_ = auVar129._12_4_ + 0x800 >> 0xc;
  auVar431 = packssdw(auVar319,auVar152);
  local_178 = auVar2._0_2_;
  uStack_176 = auVar2._2_2_;
  uStack_174 = auVar2._4_2_;
  uStack_172 = auVar2._6_2_;
  uStack_170 = auVar2._8_2_;
  uStack_16e = auVar2._10_2_;
  uStack_16c = auVar2._12_2_;
  uStack_16a = auVar2._14_2_;
  auVar227._0_12_ = auVar481._0_12_;
  auVar227._12_2_ = auVar481._6_2_;
  auVar227._14_2_ = uStack_172;
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._0_10_ = auVar481._0_10_;
  auVar226._10_2_ = uStack_174;
  auVar225._10_6_ = auVar226._10_6_;
  auVar225._0_8_ = auVar481._0_8_;
  auVar225._8_2_ = auVar481._4_2_;
  auVar224._8_8_ = auVar225._8_8_;
  auVar224._6_2_ = uStack_176;
  auVar224._4_2_ = auVar481._2_2_;
  auVar224._0_2_ = auVar481._0_2_;
  auVar224._2_2_ = local_178;
  auVar153._2_2_ = uStack_170;
  auVar153._0_2_ = auVar481._8_2_;
  auVar153._4_2_ = auVar481._10_2_;
  auVar153._6_2_ = uStack_16e;
  auVar153._8_2_ = auVar481._12_2_;
  auVar153._10_2_ = uStack_16c;
  auVar153._12_2_ = auVar481._14_2_;
  auVar153._14_2_ = uStack_16a;
  auVar129 = pmaddwd(auVar224,auVar455);
  auVar2 = pmaddwd(auVar153,auVar455);
  auVar439._0_4_ = auVar129._0_4_ + 0x800 >> 0xc;
  auVar439._4_4_ = auVar129._4_4_ + 0x800 >> 0xc;
  auVar439._8_4_ = auVar129._8_4_ + 0x800 >> 0xc;
  auVar439._12_4_ = auVar129._12_4_ + 0x800 >> 0xc;
  auVar38._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar38._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar38._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar38._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar440 = packssdw(auVar439,auVar38);
  auVar129 = pmaddwd(auVar224,auVar132);
  auVar2 = pmaddwd(auVar153,auVar132);
  auVar228._0_4_ = auVar129._0_4_ + 0x800 >> 0xc;
  auVar228._4_4_ = auVar129._4_4_ + 0x800 >> 0xc;
  auVar228._8_4_ = auVar129._8_4_ + 0x800 >> 0xc;
  auVar228._12_4_ = auVar129._12_4_ + 0x800 >> 0xc;
  auVar154._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar154._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar154._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar154._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar164 = packssdw(auVar228,auVar154);
  local_348 = auVar4._0_2_;
  uStack_346 = auVar4._2_2_;
  uStack_344 = auVar4._4_2_;
  uStack_342 = auVar4._6_2_;
  uStack_340 = auVar4._8_2_;
  uStack_33e = auVar4._10_2_;
  uStack_33c = auVar4._12_2_;
  uStack_33a = auVar4._14_2_;
  auVar407._0_12_ = auVar305._0_12_;
  auVar407._12_2_ = auVar305._6_2_;
  auVar407._14_2_ = uStack_342;
  auVar406._12_4_ = auVar407._12_4_;
  auVar406._0_10_ = auVar305._0_10_;
  auVar406._10_2_ = uStack_344;
  auVar405._10_6_ = auVar406._10_6_;
  auVar405._0_8_ = auVar305._0_8_;
  auVar405._8_2_ = auVar305._4_2_;
  auVar404._8_8_ = auVar405._8_8_;
  auVar404._6_2_ = uStack_346;
  auVar404._4_2_ = auVar305._2_2_;
  auVar404._0_2_ = auVar305._0_2_;
  auVar404._2_2_ = local_348;
  auVar192._2_2_ = uStack_340;
  auVar192._0_2_ = auVar305._8_2_;
  auVar192._4_2_ = auVar305._10_2_;
  auVar192._6_2_ = uStack_33e;
  auVar192._8_2_ = auVar305._12_2_;
  auVar192._10_2_ = uStack_33c;
  auVar192._12_2_ = auVar305._14_2_;
  auVar192._14_2_ = uStack_33a;
  auVar2 = pmaddwd(auVar404,auVar115);
  auVar4 = pmaddwd(auVar192,auVar115);
  auVar155._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar155._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar155._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar155._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar39._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar39._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar39._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar39._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar2 = packssdw(auVar155,auVar39);
  auVar129 = pmaddwd(auVar404,auVar455);
  auVar4 = pmaddwd(auVar192,auVar455);
  auVar408._0_4_ = auVar129._0_4_ + 0x800 >> 0xc;
  auVar408._4_4_ = auVar129._4_4_ + 0x800 >> 0xc;
  auVar408._8_4_ = auVar129._8_4_ + 0x800 >> 0xc;
  auVar408._12_4_ = auVar129._12_4_ + 0x800 >> 0xc;
  auVar193._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar193._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar193._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar193._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar481 = packssdw(auVar408,auVar193);
  local_288 = auVar6._0_2_;
  uStack_286 = auVar6._2_2_;
  uStack_284 = auVar6._4_2_;
  uStack_282 = auVar6._6_2_;
  uStack_280 = auVar6._8_2_;
  uStack_27e = auVar6._10_2_;
  uStack_27c = auVar6._12_2_;
  uStack_27a = auVar6._14_2_;
  auVar369._0_12_ = auVar456._0_12_;
  auVar369._12_2_ = auVar456._6_2_;
  auVar369._14_2_ = uStack_282;
  auVar368._12_4_ = auVar369._12_4_;
  auVar368._0_10_ = auVar456._0_10_;
  auVar368._10_2_ = uStack_284;
  auVar367._10_6_ = auVar368._10_6_;
  auVar367._0_8_ = auVar456._0_8_;
  auVar367._8_2_ = auVar456._4_2_;
  auVar366._8_8_ = auVar367._8_8_;
  auVar366._6_2_ = uStack_286;
  auVar366._4_2_ = auVar456._2_2_;
  auVar366._0_2_ = auVar456._0_2_;
  auVar366._2_2_ = local_288;
  auVar457._2_2_ = uStack_280;
  auVar457._0_2_ = auVar456._8_2_;
  auVar457._4_2_ = auVar456._10_2_;
  auVar457._6_2_ = uStack_27e;
  auVar457._8_2_ = auVar456._12_2_;
  auVar457._10_2_ = uStack_27c;
  auVar457._12_2_ = auVar456._14_2_;
  auVar457._14_2_ = uStack_27a;
  auVar4 = pmaddwd(auVar366,auVar115);
  auVar6 = pmaddwd(auVar457,auVar115);
  auVar40._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar40._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar40._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar40._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar194._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar194._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar194._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar194._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar40,auVar194);
  auVar6 = pmaddwd(auVar366,auVar455);
  auVar129 = pmaddwd(auVar457,auVar455);
  auVar370._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar370._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar370._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar370._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar458._0_4_ = auVar129._0_4_ + 0x800 >> 0xc;
  auVar458._4_4_ = auVar129._4_4_ + 0x800 >> 0xc;
  auVar458._8_4_ = auVar129._8_4_ + 0x800 >> 0xc;
  auVar458._12_4_ = auVar129._12_4_ + 0x800 >> 0xc;
  auVar139 = packssdw(auVar370,auVar458);
  auVar223 = paddsw(auVar121,auVar291);
  auVar129 = psubsw(auVar121,auVar291);
  auVar272 = paddsw(auVar5,auVar395);
  auVar395 = psubsw(auVar5,auVar395);
  auVar250 = paddsw(auVar142,auVar485);
  auVar400 = psubsw(auVar142,auVar485);
  auVar252 = paddsw(auVar451,auVar274);
  auVar63 = psubsw(auVar451,auVar274);
  auVar121 = psubsw(auVar288,auVar7);
  auVar454 = paddsw(auVar288,auVar7);
  auVar131 = psubsw(auVar396,auVar452);
  auVar451 = paddsw(auVar396,auVar452);
  auVar142 = psubsw(auVar62,auVar256);
  auVar486 = paddsw(auVar62,auVar256);
  auVar456 = psubsw(auVar160,auVar401);
  auVar421 = paddsw(auVar160,auVar401);
  auVar487 = paddsw(auVar65,auVar213);
  auVar160 = psubsw(auVar65,auVar213);
  auVar488 = paddsw(auVar103,auVar3);
  auVar274 = psubsw(auVar103,auVar3);
  auVar291 = paddsw(auVar111,auVar415);
  auVar65 = psubsw(auVar111,auVar415);
  auVar305 = paddsw(auVar311,auVar398);
  auVar256 = psubsw(auVar311,auVar398);
  auVar452 = psubsw(auVar67,auVar217);
  auVar401 = paddsw(auVar67,auVar217);
  auVar415 = psubsw(auVar218,auVar54);
  auVar218 = paddsw(auVar218,auVar54);
  auVar396 = psubsw(auVar354,auVar119);
  auVar66 = paddsw(auVar119,auVar354);
  auVar119 = psubsw(auVar107,auVar109);
  auVar312 = paddsw(auVar109,auVar107);
  auVar217 = paddsw(auVar290,auVar254);
  auVar54 = psubsw(auVar290,auVar254);
  auVar398 = paddsw(auVar290,auVar105);
  auVar363 = psubsw(auVar290,auVar105);
  auVar288 = paddsw(auVar290,auVar177);
  auVar213 = psubsw(auVar290,auVar177);
  auVar462._0_12_ = auVar162._0_12_;
  auVar462._12_2_ = auVar162._6_2_;
  auVar462._14_2_ = auVar378._6_2_;
  auVar461._12_4_ = auVar462._12_4_;
  auVar461._0_10_ = auVar162._0_10_;
  auVar461._10_2_ = auVar378._4_2_;
  auVar460._10_6_ = auVar461._10_6_;
  auVar460._0_8_ = auVar162._0_8_;
  auVar460._8_2_ = auVar162._4_2_;
  auVar459._8_8_ = auVar460._8_8_;
  auVar459._6_2_ = auVar378._2_2_;
  auVar459._4_2_ = auVar162._2_2_;
  auVar459._0_2_ = auVar162._0_2_;
  auVar459._2_2_ = auVar378._0_2_;
  auVar195._2_2_ = auVar378._8_2_;
  auVar195._0_2_ = auVar162._8_2_;
  auVar195._4_2_ = auVar162._10_2_;
  auVar195._6_2_ = auVar378._10_2_;
  auVar195._8_2_ = auVar162._12_2_;
  auVar195._10_2_ = auVar378._12_2_;
  auVar195._12_2_ = auVar162._14_2_;
  auVar195._14_2_ = auVar378._14_2_;
  auVar103 = pmaddwd(auVar459,auVar275);
  auVar3 = pmaddwd(auVar195,auVar275);
  auVar7._0_4_ = auVar103._0_4_ + 0x800 >> 0xc;
  auVar7._4_4_ = auVar103._4_4_ + 0x800 >> 0xc;
  auVar7._8_4_ = auVar103._8_4_ + 0x800 >> 0xc;
  auVar7._12_4_ = auVar103._12_4_ + 0x800 >> 0xc;
  auVar69._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar69._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar69._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar69._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar103 = packssdw(auVar7,auVar69);
  auVar5 = pmaddwd(auVar459,auVar150);
  auVar3 = pmaddwd(auVar195,auVar150);
  auVar463._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar463._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar463._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar463._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar196._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar196._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar196._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar196._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar485 = packssdw(auVar463,auVar196);
  local_148 = auVar329._0_2_;
  uStack_146 = auVar329._2_2_;
  uStack_144 = auVar329._4_2_;
  uStack_142 = auVar329._6_2_;
  uStack_140 = auVar329._8_2_;
  uStack_13e = auVar329._10_2_;
  uStack_13c = auVar329._12_2_;
  uStack_13a = auVar329._14_2_;
  auVar467._0_12_ = auVar389._0_12_;
  auVar467._12_2_ = auVar389._6_2_;
  auVar467._14_2_ = uStack_142;
  auVar466._12_4_ = auVar467._12_4_;
  auVar466._0_10_ = auVar389._0_10_;
  auVar466._10_2_ = uStack_144;
  auVar465._10_6_ = auVar466._10_6_;
  auVar465._0_8_ = auVar389._0_8_;
  auVar465._8_2_ = auVar389._4_2_;
  auVar464._8_8_ = auVar465._8_8_;
  auVar464._6_2_ = uStack_146;
  auVar464._4_2_ = auVar389._2_2_;
  auVar464._0_2_ = auVar389._0_2_;
  auVar464._2_2_ = local_148;
  auVar489._2_2_ = uStack_140;
  auVar489._0_2_ = auVar389._8_2_;
  auVar489._4_2_ = auVar389._10_2_;
  auVar489._6_2_ = uStack_13e;
  auVar489._8_2_ = auVar389._12_2_;
  auVar489._10_2_ = uStack_13c;
  auVar489._12_2_ = auVar389._14_2_;
  auVar489._14_2_ = uStack_13a;
  auVar5 = pmaddwd(auVar464,auVar275);
  auVar3 = pmaddwd(auVar489,auVar275);
  auVar197._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar197._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar197._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar197._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar70._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar70._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar70._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar70._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar378 = packssdw(auVar197,auVar70);
  auVar3 = pmaddwd(auVar464,auVar150);
  auVar5 = pmaddwd(auVar489,auVar150);
  auVar468._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar468._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar468._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar468._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar490._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar490._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar490._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar490._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar329 = packssdw(auVar468,auVar490);
  auVar385 = paddsw(auVar215,auVar171);
  auVar162 = psubsw(auVar215,auVar171);
  auVar491 = paddsw(auVar140,auVar437);
  auVar3 = psubsw(auVar140,auVar437);
  auVar111 = paddsw(auVar333,auVar4);
  auVar4 = psubsw(auVar333,auVar4);
  auVar354 = paddsw(auVar440,auVar2);
  auVar389 = psubsw(auVar440,auVar2);
  auVar107 = psubsw(auVar483,auVar450);
  auVar62 = paddsw(auVar483,auVar450);
  auVar5 = psubsw(auVar9,auVar480);
  auVar290 = paddsw(auVar9,auVar480);
  auVar6 = psubsw(auVar431,auVar139);
  auVar105 = paddsw(auVar139,auVar431);
  auVar171 = psubsw(auVar164,auVar481);
  auVar215 = paddsw(auVar481,auVar164);
  auVar201._0_12_ = auVar63._0_12_;
  auVar201._12_2_ = auVar63._6_2_;
  auVar201._14_2_ = auVar119._6_2_;
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._0_10_ = auVar63._0_10_;
  auVar200._10_2_ = auVar119._4_2_;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._0_8_ = auVar63._0_8_;
  auVar199._8_2_ = auVar63._4_2_;
  auVar198._8_8_ = auVar199._8_8_;
  auVar198._6_2_ = auVar119._2_2_;
  auVar198._4_2_ = auVar63._2_2_;
  auVar198._0_2_ = auVar63._0_2_;
  auVar198._2_2_ = auVar119._0_2_;
  auVar71._2_2_ = auVar119._8_2_;
  auVar71._0_2_ = auVar63._8_2_;
  auVar71._4_2_ = auVar63._10_2_;
  auVar71._6_2_ = auVar119._10_2_;
  auVar71._8_2_ = auVar63._12_2_;
  auVar71._10_2_ = auVar119._12_2_;
  auVar71._12_2_ = auVar63._14_2_;
  auVar71._14_2_ = auVar119._14_2_;
  auVar119 = pmaddwd(auVar198,auVar455);
  auVar2 = pmaddwd(auVar71,auVar455);
  auVar156._0_4_ = auVar119._0_4_ + 0x800 >> 0xc;
  auVar156._4_4_ = auVar119._4_4_ + 0x800 >> 0xc;
  auVar156._8_4_ = auVar119._8_4_ + 0x800 >> 0xc;
  auVar156._12_4_ = auVar119._12_4_ + 0x800 >> 0xc;
  auVar41._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar41._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar41._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar41._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar109 = packssdw(auVar156,auVar41);
  auVar119 = pmaddwd(auVar198,auVar132);
  auVar2 = pmaddwd(auVar71,auVar132);
  auVar202._0_4_ = auVar119._0_4_ + 0x800 >> 0xc;
  auVar202._4_4_ = auVar119._4_4_ + 0x800 >> 0xc;
  auVar202._8_4_ = auVar119._8_4_ + 0x800 >> 0xc;
  auVar202._12_4_ = auVar119._12_4_ + 0x800 >> 0xc;
  auVar72._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar72._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar72._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar72._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar164 = packssdw(auVar202,auVar72);
  local_a8 = auVar396._0_2_;
  uStack_a6 = auVar396._2_2_;
  uStack_a4 = auVar396._4_2_;
  uStack_a2 = auVar396._6_2_;
  uStack_a0 = auVar396._8_2_;
  uStack_9e = auVar396._10_2_;
  uStack_9c = auVar396._12_2_;
  uStack_9a = auVar396._14_2_;
  auVar206._0_12_ = auVar400._0_12_;
  auVar206._12_2_ = auVar400._6_2_;
  auVar206._14_2_ = uStack_a2;
  auVar205._12_4_ = auVar206._12_4_;
  auVar205._0_10_ = auVar400._0_10_;
  auVar205._10_2_ = uStack_a4;
  auVar204._10_6_ = auVar205._10_6_;
  auVar204._0_8_ = auVar400._0_8_;
  auVar204._8_2_ = auVar400._4_2_;
  auVar203._8_8_ = auVar204._8_8_;
  auVar203._6_2_ = uStack_a6;
  auVar203._4_2_ = auVar400._2_2_;
  auVar203._0_2_ = auVar400._0_2_;
  auVar203._2_2_ = local_a8;
  auVar73._2_2_ = uStack_a0;
  auVar73._0_2_ = auVar400._8_2_;
  auVar73._4_2_ = auVar400._10_2_;
  auVar73._6_2_ = uStack_9e;
  auVar73._8_2_ = auVar400._12_2_;
  auVar73._10_2_ = uStack_9c;
  auVar73._12_2_ = auVar400._14_2_;
  auVar73._14_2_ = uStack_9a;
  auVar2 = pmaddwd(auVar203,auVar455);
  auVar119 = pmaddwd(auVar73,auVar455);
  auVar431._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar431._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar431._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar431._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar42._0_4_ = auVar119._0_4_ + 0x800 >> 0xc;
  auVar42._4_4_ = auVar119._4_4_ + 0x800 >> 0xc;
  auVar42._8_4_ = auVar119._8_4_ + 0x800 >> 0xc;
  auVar42._12_4_ = auVar119._12_4_ + 0x800 >> 0xc;
  auVar2 = packssdw(auVar431,auVar42);
  auVar396 = pmaddwd(auVar203,auVar132);
  auVar119 = pmaddwd(auVar73,auVar132);
  auVar207._0_4_ = auVar396._0_4_ + 0x800 >> 0xc;
  auVar207._4_4_ = auVar396._4_4_ + 0x800 >> 0xc;
  auVar207._8_4_ = auVar396._8_4_ + 0x800 >> 0xc;
  auVar207._12_4_ = auVar396._12_4_ + 0x800 >> 0xc;
  auVar74._0_4_ = auVar119._0_4_ + 0x800 >> 0xc;
  auVar74._4_4_ = auVar119._4_4_ + 0x800 >> 0xc;
  auVar74._8_4_ = auVar119._8_4_ + 0x800 >> 0xc;
  auVar74._12_4_ = auVar119._12_4_ + 0x800 >> 0xc;
  auVar7 = packssdw(auVar207,auVar74);
  local_3f8 = auVar415._0_2_;
  uStack_3f6 = auVar415._2_2_;
  uStack_3f4 = auVar415._4_2_;
  uStack_3f2 = auVar415._6_2_;
  uStack_3f0 = auVar415._8_2_;
  uStack_3ee = auVar415._10_2_;
  uStack_3ec = auVar415._12_2_;
  uStack_3ea = auVar415._14_2_;
  auVar211._0_12_ = auVar395._0_12_;
  auVar211._12_2_ = auVar395._6_2_;
  auVar211._14_2_ = uStack_3f2;
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._0_10_ = auVar395._0_10_;
  auVar210._10_2_ = uStack_3f4;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._0_8_ = auVar395._0_8_;
  auVar209._8_2_ = auVar395._4_2_;
  auVar208._8_8_ = auVar209._8_8_;
  auVar208._6_2_ = uStack_3f6;
  auVar208._4_2_ = auVar395._2_2_;
  auVar208._0_2_ = auVar395._0_2_;
  auVar208._2_2_ = local_3f8;
  auVar75._2_2_ = uStack_3f0;
  auVar75._0_2_ = auVar395._8_2_;
  auVar75._4_2_ = auVar395._10_2_;
  auVar75._6_2_ = uStack_3ee;
  auVar75._8_2_ = auVar395._12_2_;
  auVar75._10_2_ = uStack_3ec;
  auVar75._12_2_ = auVar395._14_2_;
  auVar75._14_2_ = uStack_3ea;
  auVar119 = pmaddwd(auVar208,auVar455);
  auVar396 = pmaddwd(auVar75,auVar455);
  auVar437._0_4_ = auVar119._0_4_ + 0x800 >> 0xc;
  auVar437._4_4_ = auVar119._4_4_ + 0x800 >> 0xc;
  auVar437._8_4_ = auVar119._8_4_ + 0x800 >> 0xc;
  auVar437._12_4_ = auVar119._12_4_ + 0x800 >> 0xc;
  auVar43._0_4_ = auVar396._0_4_ + 0x800 >> 0xc;
  auVar43._4_4_ = auVar396._4_4_ + 0x800 >> 0xc;
  auVar43._8_4_ = auVar396._8_4_ + 0x800 >> 0xc;
  auVar43._12_4_ = auVar396._12_4_ + 0x800 >> 0xc;
  auVar119 = packssdw(auVar437,auVar43);
  auVar254 = pmaddwd(auVar208,auVar132);
  auVar396 = pmaddwd(auVar75,auVar132);
  auVar212._0_4_ = auVar254._0_4_ + 0x800 >> 0xc;
  auVar212._4_4_ = auVar254._4_4_ + 0x800 >> 0xc;
  auVar212._8_4_ = auVar254._8_4_ + 0x800 >> 0xc;
  auVar212._12_4_ = auVar254._12_4_ + 0x800 >> 0xc;
  auVar76._0_4_ = auVar396._0_4_ + 0x800 >> 0xc;
  auVar76._4_4_ = auVar396._4_4_ + 0x800 >> 0xc;
  auVar76._8_4_ = auVar396._8_4_ + 0x800 >> 0xc;
  auVar76._12_4_ = auVar396._12_4_ + 0x800 >> 0xc;
  auVar431 = packssdw(auVar212,auVar76);
  local_418 = auVar452._0_2_;
  uStack_416 = auVar452._2_2_;
  uStack_414 = auVar452._4_2_;
  uStack_412 = auVar452._6_2_;
  uStack_410 = auVar452._8_2_;
  uStack_40e = auVar452._10_2_;
  uStack_40c = auVar452._12_2_;
  uStack_40a = auVar452._14_2_;
  auVar9._0_12_ = auVar129._0_12_;
  auVar9._12_2_ = auVar129._6_2_;
  auVar9._14_2_ = uStack_412;
  auVar483._12_4_ = auVar9._12_4_;
  auVar483._0_10_ = auVar129._0_10_;
  auVar483._10_2_ = uStack_414;
  auVar480._10_6_ = auVar483._10_6_;
  auVar480._0_8_ = auVar129._0_8_;
  auVar480._8_2_ = auVar129._4_2_;
  auVar450._8_8_ = auVar480._8_8_;
  auVar450._6_2_ = uStack_416;
  auVar450._4_2_ = auVar129._2_2_;
  auVar450._0_2_ = auVar129._0_2_;
  auVar450._2_2_ = local_418;
  auVar77._2_2_ = uStack_410;
  auVar77._0_2_ = auVar129._8_2_;
  auVar77._4_2_ = auVar129._10_2_;
  auVar77._6_2_ = uStack_40e;
  auVar77._8_2_ = auVar129._12_2_;
  auVar77._10_2_ = uStack_40c;
  auVar77._12_2_ = auVar129._14_2_;
  auVar77._14_2_ = uStack_40a;
  auVar396 = pmaddwd(auVar450,auVar132);
  auVar395 = pmaddwd(auVar77,auVar132);
  auVar452 = pmaddwd(auVar450,auVar455);
  auVar254 = pmaddwd(auVar77,auVar455);
  auVar320._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar320._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar320._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar320._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar44._0_4_ = auVar254._0_4_ + 0x800 >> 0xc;
  auVar44._4_4_ = auVar254._4_4_ + 0x800 >> 0xc;
  auVar44._8_4_ = auVar254._8_4_ + 0x800 >> 0xc;
  auVar44._12_4_ = auVar254._12_4_ + 0x800 >> 0xc;
  auVar450 = packssdw(auVar320,auVar44);
  auVar67._0_4_ = auVar396._0_4_ + 0x800 >> 0xc;
  auVar67._4_4_ = auVar396._4_4_ + 0x800 >> 0xc;
  auVar67._8_4_ = auVar396._8_4_ + 0x800 >> 0xc;
  auVar67._12_4_ = auVar396._12_4_ + 0x800 >> 0xc;
  auVar78._0_4_ = auVar395._0_4_ + 0x800 >> 0xc;
  auVar78._4_4_ = auVar395._4_4_ + 0x800 >> 0xc;
  auVar78._8_4_ = auVar395._8_4_ + 0x800 >> 0xc;
  auVar78._12_4_ = auVar395._12_4_ + 0x800 >> 0xc;
  auVar396 = packssdw(auVar67,auVar78);
  local_398 = auVar160._0_2_;
  uStack_396 = auVar160._2_2_;
  uStack_394 = auVar160._4_2_;
  uStack_392 = auVar160._6_2_;
  uStack_390 = auVar160._8_2_;
  uStack_38e = auVar160._10_2_;
  uStack_38c = auVar160._12_2_;
  uStack_38a = auVar160._14_2_;
  auVar82._0_12_ = auVar121._0_12_;
  auVar82._12_2_ = auVar121._6_2_;
  auVar82._14_2_ = uStack_392;
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._0_10_ = auVar121._0_10_;
  auVar81._10_2_ = uStack_394;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._0_8_ = auVar121._0_8_;
  auVar80._8_2_ = auVar121._4_2_;
  auVar79._8_8_ = auVar80._8_8_;
  auVar79._6_2_ = uStack_396;
  auVar79._4_2_ = auVar121._2_2_;
  auVar79._0_2_ = auVar121._0_2_;
  auVar79._2_2_ = local_398;
  auVar276._2_2_ = uStack_390;
  auVar276._0_2_ = auVar121._8_2_;
  auVar276._4_2_ = auVar121._10_2_;
  auVar276._6_2_ = uStack_38e;
  auVar276._8_2_ = auVar121._12_2_;
  auVar276._10_2_ = uStack_38c;
  auVar276._12_2_ = auVar121._14_2_;
  auVar276._14_2_ = uStack_38a;
  auVar254 = pmaddwd(auVar79,auVar115);
  auVar395 = pmaddwd(auVar276,auVar115);
  auVar121._0_4_ = auVar254._0_4_ + 0x800 >> 0xc;
  auVar121._4_4_ = auVar254._4_4_ + 0x800 >> 0xc;
  auVar121._8_4_ = auVar254._8_4_ + 0x800 >> 0xc;
  auVar121._12_4_ = auVar254._12_4_ + 0x800 >> 0xc;
  auVar45._0_4_ = auVar395._0_4_ + 0x800 >> 0xc;
  auVar45._4_4_ = auVar395._4_4_ + 0x800 >> 0xc;
  auVar45._8_4_ = auVar395._8_4_ + 0x800 >> 0xc;
  auVar45._12_4_ = auVar395._12_4_ + 0x800 >> 0xc;
  auVar254 = packssdw(auVar121,auVar45);
  auVar395 = pmaddwd(auVar79,auVar455);
  auVar452 = pmaddwd(auVar276,auVar455);
  auVar83._0_4_ = auVar395._0_4_ + 0x800 >> 0xc;
  auVar83._4_4_ = auVar395._4_4_ + 0x800 >> 0xc;
  auVar83._8_4_ = auVar395._8_4_ + 0x800 >> 0xc;
  auVar83._12_4_ = auVar395._12_4_ + 0x800 >> 0xc;
  auVar277._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar277._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar277._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar277._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar129 = packssdw(auVar83,auVar277);
  local_388 = auVar274._0_2_;
  uStack_386 = auVar274._2_2_;
  uStack_384 = auVar274._4_2_;
  uStack_382 = auVar274._6_2_;
  uStack_380 = auVar274._8_2_;
  uStack_37e = auVar274._10_2_;
  uStack_37c = auVar274._12_2_;
  uStack_37a = auVar274._14_2_;
  auVar49._0_12_ = auVar131._0_12_;
  auVar49._12_2_ = auVar131._6_2_;
  auVar49._14_2_ = uStack_382;
  auVar48._12_4_ = auVar49._12_4_;
  auVar48._0_10_ = auVar131._0_10_;
  auVar48._10_2_ = uStack_384;
  auVar47._10_6_ = auVar48._10_6_;
  auVar47._0_8_ = auVar131._0_8_;
  auVar47._8_2_ = auVar131._4_2_;
  auVar46._8_8_ = auVar47._8_8_;
  auVar46._6_2_ = uStack_386;
  auVar46._4_2_ = auVar131._2_2_;
  auVar46._0_2_ = auVar131._0_2_;
  auVar46._2_2_ = local_388;
  auVar341._2_2_ = uStack_380;
  auVar341._0_2_ = auVar131._8_2_;
  auVar341._4_2_ = auVar131._10_2_;
  auVar341._6_2_ = uStack_37e;
  auVar341._8_2_ = auVar131._12_2_;
  auVar341._10_2_ = uStack_37c;
  auVar341._12_2_ = auVar131._14_2_;
  auVar341._14_2_ = uStack_37a;
  auVar395 = pmaddwd(auVar46,auVar115);
  auVar452 = pmaddwd(auVar341,auVar115);
  auVar131._0_4_ = auVar395._0_4_ + 0x800 >> 0xc;
  auVar131._4_4_ = auVar395._4_4_ + 0x800 >> 0xc;
  auVar131._8_4_ = auVar395._8_4_ + 0x800 >> 0xc;
  auVar131._12_4_ = auVar395._12_4_ + 0x800 >> 0xc;
  auVar84._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar84._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar84._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar84._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar395 = packssdw(auVar131,auVar84);
  auVar452 = pmaddwd(auVar46,auVar455);
  auVar415 = pmaddwd(auVar341,auVar455);
  auVar50._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar50._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar50._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar50._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar342._0_4_ = auVar415._0_4_ + 0x800 >> 0xc;
  auVar342._4_4_ = auVar415._4_4_ + 0x800 >> 0xc;
  auVar342._8_4_ = auVar415._8_4_ + 0x800 >> 0xc;
  auVar342._12_4_ = auVar415._12_4_ + 0x800 >> 0xc;
  auVar415 = packssdw(auVar50,auVar342);
  local_2e8 = auVar65._0_2_;
  uStack_2e6 = auVar65._2_2_;
  uStack_2e4 = auVar65._4_2_;
  uStack_2e2 = auVar65._6_2_;
  uStack_2e0 = auVar65._8_2_;
  uStack_2de = auVar65._10_2_;
  uStack_2dc = auVar65._12_2_;
  uStack_2da = auVar65._14_2_;
  auVar232._0_12_ = auVar142._0_12_;
  auVar232._12_2_ = auVar142._6_2_;
  auVar232._14_2_ = uStack_2e2;
  auVar231._12_4_ = auVar232._12_4_;
  auVar231._0_10_ = auVar142._0_10_;
  auVar231._10_2_ = uStack_2e4;
  auVar230._10_6_ = auVar231._10_6_;
  auVar230._0_8_ = auVar142._0_8_;
  auVar230._8_2_ = auVar142._4_2_;
  auVar229._8_8_ = auVar230._8_8_;
  auVar229._6_2_ = uStack_2e6;
  auVar229._4_2_ = auVar142._2_2_;
  auVar229._0_2_ = auVar142._0_2_;
  auVar229._2_2_ = local_2e8;
  auVar139._2_2_ = uStack_2e0;
  auVar139._0_2_ = auVar142._8_2_;
  auVar139._4_2_ = auVar142._10_2_;
  auVar139._6_2_ = uStack_2de;
  auVar139._8_2_ = auVar142._12_2_;
  auVar139._10_2_ = uStack_2dc;
  auVar139._12_2_ = auVar142._14_2_;
  auVar139._14_2_ = uStack_2da;
  auVar452 = pmaddwd(auVar229,auVar115);
  auVar65 = pmaddwd(auVar139,auVar115);
  auVar51._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar51._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar51._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar51._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar85._0_4_ = auVar65._0_4_ + 0x800 >> 0xc;
  auVar85._4_4_ = auVar65._4_4_ + 0x800 >> 0xc;
  auVar85._8_4_ = auVar65._8_4_ + 0x800 >> 0xc;
  auVar85._12_4_ = auVar65._12_4_ + 0x800 >> 0xc;
  auVar160 = packssdw(auVar51,auVar85);
  auVar65 = pmaddwd(auVar229,auVar455);
  auVar452 = pmaddwd(auVar139,auVar455);
  auVar233._0_4_ = auVar65._0_4_ + 0x800 >> 0xc;
  auVar233._4_4_ = auVar65._4_4_ + 0x800 >> 0xc;
  auVar233._8_4_ = auVar65._8_4_ + 0x800 >> 0xc;
  auVar233._12_4_ = auVar65._12_4_ + 0x800 >> 0xc;
  auVar140._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar140._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar140._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar140._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar9 = packssdw(auVar233,auVar140);
  local_2d8 = auVar256._0_2_;
  uStack_2d6 = auVar256._2_2_;
  uStack_2d4 = auVar256._4_2_;
  uStack_2d2 = auVar256._6_2_;
  uStack_2d0 = auVar256._8_2_;
  uStack_2ce = auVar256._10_2_;
  uStack_2cc = auVar256._12_2_;
  uStack_2ca = auVar256._14_2_;
  auVar89._0_12_ = auVar456._0_12_;
  auVar89._12_2_ = auVar456._6_2_;
  auVar89._14_2_ = uStack_2d2;
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._0_10_ = auVar456._0_10_;
  auVar88._10_2_ = uStack_2d4;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._0_8_ = auVar456._0_8_;
  auVar87._8_2_ = auVar456._4_2_;
  auVar86._8_8_ = auVar87._8_8_;
  auVar86._6_2_ = uStack_2d6;
  auVar86._4_2_ = auVar456._2_2_;
  auVar86._0_2_ = auVar456._0_2_;
  auVar86._2_2_ = local_2d8;
  auVar234._2_2_ = uStack_2d0;
  auVar234._0_2_ = auVar456._8_2_;
  auVar234._4_2_ = auVar456._10_2_;
  auVar234._6_2_ = uStack_2ce;
  auVar234._8_2_ = auVar456._12_2_;
  auVar234._10_2_ = uStack_2cc;
  auVar234._12_2_ = auVar456._14_2_;
  auVar234._14_2_ = uStack_2ca;
  auVar177 = pmaddwd(auVar86,auVar115);
  auVar65 = pmaddwd(auVar115,auVar234);
  auVar452 = pmaddwd(auVar86,auVar455);
  auVar115 = pmaddwd(auVar234,auVar455);
  auVar371._0_4_ = auVar177._0_4_ + 0x800 >> 0xc;
  auVar371._4_4_ = auVar177._4_4_ + 0x800 >> 0xc;
  auVar371._8_4_ = auVar177._8_4_ + 0x800 >> 0xc;
  auVar371._12_4_ = auVar177._12_4_ + 0x800 >> 0xc;
  auVar157._0_4_ = auVar65._0_4_ + 0x800 >> 0xc;
  auVar157._4_4_ = auVar65._4_4_ + 0x800 >> 0xc;
  auVar157._8_4_ = auVar65._8_4_ + 0x800 >> 0xc;
  auVar157._12_4_ = auVar65._12_4_ + 0x800 >> 0xc;
  auVar437 = packssdw(auVar371,auVar157);
  auVar90._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar90._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar90._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar90._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar235._0_4_ = auVar115._0_4_ + 0x800 >> 0xc;
  auVar235._4_4_ = auVar115._4_4_ + 0x800 >> 0xc;
  auVar235._8_4_ = auVar115._8_4_ + 0x800 >> 0xc;
  auVar235._12_4_ = auVar115._12_4_ + 0x800 >> 0xc;
  auVar115 = packssdw(auVar90,auVar235);
  auVar177 = paddsw(auVar217,auVar117);
  auVar452 = psubsw(auVar217,auVar117);
  auVar117 = paddsw(auVar398,auVar438);
  auVar65 = psubsw(auVar398,auVar438);
  auVar311 = paddsw(auVar288,auVar485);
  auVar256 = psubsw(auVar288,auVar485);
  auVar398 = paddsw(auVar113,auVar329);
  auVar288 = psubsw(auVar113,auVar329);
  auVar329 = paddsw(auVar360,auVar378);
  auVar217 = psubsw(auVar360,auVar378);
  auVar333 = paddsw(auVar213,auVar103);
  auVar213 = psubsw(auVar213,auVar103);
  auVar400 = paddsw(auVar363,auVar294);
  auVar103 = psubsw(auVar363,auVar294);
  auVar294 = paddsw(auVar54,auVar133);
  auVar113 = psubsw(auVar54,auVar133);
  auVar472._0_12_ = auVar389._0_12_;
  auVar472._12_2_ = auVar389._6_2_;
  auVar472._14_2_ = auVar171._6_2_;
  auVar471._12_4_ = auVar472._12_4_;
  auVar471._0_10_ = auVar389._0_10_;
  auVar471._10_2_ = auVar171._4_2_;
  auVar470._10_6_ = auVar471._10_6_;
  auVar470._0_8_ = auVar389._0_8_;
  auVar470._8_2_ = auVar389._4_2_;
  auVar469._8_8_ = auVar470._8_8_;
  auVar469._6_2_ = auVar171._2_2_;
  auVar469._4_2_ = auVar389._2_2_;
  auVar469._0_2_ = auVar389._0_2_;
  auVar469._2_2_ = auVar171._0_2_;
  auVar441._2_2_ = auVar171._8_2_;
  auVar441._0_2_ = auVar389._8_2_;
  auVar441._4_2_ = auVar389._10_2_;
  auVar441._6_2_ = auVar171._10_2_;
  auVar441._8_2_ = auVar389._12_2_;
  auVar441._10_2_ = auVar171._12_2_;
  auVar441._12_2_ = auVar389._14_2_;
  auVar441._14_2_ = auVar171._14_2_;
  auVar360 = pmaddwd(auVar469,auVar275);
  auVar54 = pmaddwd(auVar441,auVar275);
  auVar492._0_4_ = auVar360._0_4_ + 0x800 >> 0xc;
  auVar492._4_4_ = auVar360._4_4_ + 0x800 >> 0xc;
  auVar492._8_4_ = auVar360._8_4_ + 0x800 >> 0xc;
  auVar492._12_4_ = auVar360._12_4_ + 0x800 >> 0xc;
  auVar133._0_4_ = auVar54._0_4_ + 0x800 >> 0xc;
  auVar133._4_4_ = auVar54._4_4_ + 0x800 >> 0xc;
  auVar133._8_4_ = auVar54._8_4_ + 0x800 >> 0xc;
  auVar133._12_4_ = auVar54._12_4_ + 0x800 >> 0xc;
  auVar485 = packssdw(auVar492,auVar133);
  auVar360 = pmaddwd(auVar469,auVar150);
  auVar54 = pmaddwd(auVar441,auVar150);
  auVar473._0_4_ = auVar360._0_4_ + 0x800 >> 0xc;
  auVar473._4_4_ = auVar360._4_4_ + 0x800 >> 0xc;
  auVar473._8_4_ = auVar360._8_4_ + 0x800 >> 0xc;
  auVar473._12_4_ = auVar360._12_4_ + 0x800 >> 0xc;
  auVar442._0_4_ = auVar54._0_4_ + 0x800 >> 0xc;
  auVar442._4_4_ = auVar54._4_4_ + 0x800 >> 0xc;
  auVar442._8_4_ = auVar54._8_4_ + 0x800 >> 0xc;
  auVar442._12_4_ = auVar54._12_4_ + 0x800 >> 0xc;
  auVar274 = packssdw(auVar473,auVar442);
  local_88 = auVar6._0_2_;
  uStack_86 = auVar6._2_2_;
  uStack_84 = auVar6._4_2_;
  uStack_82 = auVar6._6_2_;
  uStack_80 = auVar6._8_2_;
  uStack_7e = auVar6._10_2_;
  uStack_7c = auVar6._12_2_;
  uStack_7a = auVar6._14_2_;
  auVar281._0_12_ = auVar4._0_12_;
  auVar281._12_2_ = auVar4._6_2_;
  auVar281._14_2_ = uStack_82;
  auVar280._12_4_ = auVar281._12_4_;
  auVar280._0_10_ = auVar4._0_10_;
  auVar280._10_2_ = uStack_84;
  auVar279._10_6_ = auVar280._10_6_;
  auVar279._0_8_ = auVar4._0_8_;
  auVar279._8_2_ = auVar4._4_2_;
  auVar278._8_8_ = auVar279._8_8_;
  auVar278._6_2_ = uStack_86;
  auVar278._4_2_ = auVar4._2_2_;
  auVar278._0_2_ = auVar4._0_2_;
  auVar278._2_2_ = local_88;
  auVar236._2_2_ = uStack_80;
  auVar236._0_2_ = auVar4._8_2_;
  auVar236._4_2_ = auVar4._10_2_;
  auVar236._6_2_ = uStack_7e;
  auVar236._8_2_ = auVar4._12_2_;
  auVar236._10_2_ = uStack_7c;
  auVar236._12_2_ = auVar4._14_2_;
  auVar236._14_2_ = uStack_7a;
  auVar6 = pmaddwd(auVar278,auVar275);
  auVar4 = pmaddwd(auVar236,auVar275);
  auVar158._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar158._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar158._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar158._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar142._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar142._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar142._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar142._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar63 = packssdw(auVar158,auVar142);
  auVar6 = pmaddwd(auVar278,auVar150);
  auVar4 = pmaddwd(auVar236,auVar150);
  auVar282._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar282._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar282._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar282._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar237._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar237._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar237._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar237._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar121 = packssdw(auVar282,auVar237);
  local_188 = auVar5._0_2_;
  uStack_186 = auVar5._2_2_;
  uStack_184 = auVar5._4_2_;
  uStack_182 = auVar5._6_2_;
  uStack_180 = auVar5._8_2_;
  uStack_17e = auVar5._10_2_;
  uStack_17c = auVar5._12_2_;
  uStack_17a = auVar5._14_2_;
  auVar446._0_12_ = auVar3._0_12_;
  auVar446._12_2_ = auVar3._6_2_;
  auVar446._14_2_ = uStack_182;
  auVar445._12_4_ = auVar446._12_4_;
  auVar445._0_10_ = auVar3._0_10_;
  auVar445._10_2_ = uStack_184;
  auVar444._10_6_ = auVar445._10_6_;
  auVar444._0_8_ = auVar3._0_8_;
  auVar444._8_2_ = auVar3._4_2_;
  auVar443._8_8_ = auVar444._8_8_;
  auVar443._6_2_ = uStack_186;
  auVar443._4_2_ = auVar3._2_2_;
  auVar443._0_2_ = auVar3._0_2_;
  auVar443._2_2_ = local_188;
  auVar343._2_2_ = uStack_180;
  auVar343._0_2_ = auVar3._8_2_;
  auVar343._4_2_ = auVar3._10_2_;
  auVar343._6_2_ = uStack_17e;
  auVar343._8_2_ = auVar3._12_2_;
  auVar343._10_2_ = uStack_17c;
  auVar343._12_2_ = auVar3._14_2_;
  auVar343._14_2_ = uStack_17a;
  auVar3 = pmaddwd(auVar443,auVar275);
  auVar4 = pmaddwd(auVar343,auVar275);
  auVar91._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar91._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar91._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar91._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar238._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar238._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar238._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar238._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar6 = packssdw(auVar91,auVar238);
  auVar4 = pmaddwd(auVar443,auVar150);
  auVar3 = pmaddwd(auVar343,auVar150);
  auVar447._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar447._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar447._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar447._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar344._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar344._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar344._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar344._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar171 = packssdw(auVar447,auVar344);
  local_168 = auVar107._0_2_;
  uStack_166 = auVar107._2_2_;
  uStack_164 = auVar107._4_2_;
  uStack_162 = auVar107._6_2_;
  uStack_160 = auVar107._8_2_;
  uStack_15e = auVar107._10_2_;
  uStack_15c = auVar107._12_2_;
  uStack_15a = auVar107._14_2_;
  auVar242._0_12_ = auVar162._0_12_;
  auVar242._12_2_ = auVar162._6_2_;
  auVar242._14_2_ = uStack_162;
  auVar241._12_4_ = auVar242._12_4_;
  auVar241._0_10_ = auVar162._0_10_;
  auVar241._10_2_ = uStack_164;
  auVar240._10_6_ = auVar241._10_6_;
  auVar240._0_8_ = auVar162._0_8_;
  auVar240._8_2_ = auVar162._4_2_;
  auVar239._8_8_ = auVar240._8_8_;
  auVar239._6_2_ = uStack_166;
  auVar239._4_2_ = auVar162._2_2_;
  auVar239._0_2_ = auVar162._0_2_;
  auVar239._2_2_ = local_168;
  auVar423._2_2_ = uStack_160;
  auVar423._0_2_ = auVar162._8_2_;
  auVar423._4_2_ = auVar162._10_2_;
  auVar423._6_2_ = uStack_15e;
  auVar423._8_2_ = auVar162._12_2_;
  auVar423._10_2_ = uStack_15c;
  auVar423._12_2_ = auVar162._14_2_;
  auVar423._14_2_ = uStack_15a;
  auVar3 = pmaddwd(auVar239,auVar275);
  auVar4 = pmaddwd(auVar423,auVar275);
  auVar345._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar345._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar345._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar345._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar390._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar390._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar390._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar390._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar139 = packssdw(auVar345,auVar390);
  auVar3 = pmaddwd(auVar239,auVar150);
  auVar4 = pmaddwd(auVar423,auVar150);
  auVar243._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar243._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar243._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar243._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar424._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar424._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar424._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar424._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar67 = packssdw(auVar243,auVar424);
  auVar481 = paddsw(auVar223,auVar454);
  auVar454 = psubsw(auVar223,auVar454);
  auVar438 = paddsw(auVar272,auVar451);
  auVar363 = psubsw(auVar272,auVar451);
  auVar440 = paddsw(auVar250,auVar486);
  auVar378 = psubsw(auVar250,auVar486);
  auVar456 = paddsw(auVar252,auVar421);
  auVar421 = psubsw(auVar252,auVar421);
  auVar389 = paddsw(auVar109,auVar437);
  auVar437 = psubsw(auVar109,auVar437);
  auVar140 = paddsw(auVar2,auVar160);
  auVar3 = psubsw(auVar2,auVar160);
  auVar54 = paddsw(auVar119,auVar395);
  auVar4 = psubsw(auVar119,auVar395);
  auVar395 = paddsw(auVar450,auVar254);
  auVar131 = psubsw(auVar450,auVar254);
  auVar450 = psubsw(auVar401,auVar487);
  auVar254 = paddsw(auVar401,auVar487);
  auVar480 = psubsw(auVar218,auVar488);
  auVar360 = paddsw(auVar218,auVar488);
  auVar483 = psubsw(auVar66,auVar291);
  auVar160 = paddsw(auVar66,auVar291);
  auVar66 = psubsw(auVar312,auVar305);
  auVar162 = paddsw(auVar312,auVar305);
  auVar5 = psubsw(auVar164,auVar115);
  auVar115 = paddsw(auVar115,auVar164);
  auVar218 = psubsw(auVar7,auVar9);
  auVar107 = paddsw(auVar9,auVar7);
  auVar451 = psubsw(auVar431,auVar415);
  auVar415 = paddsw(auVar415,auVar431);
  auVar109 = psubsw(auVar396,auVar129);
  auVar129 = paddsw(auVar129,auVar396);
  auVar312 = paddsw(auVar177,auVar62);
  auVar9 = psubsw(auVar177,auVar62);
  auVar177 = paddsw(auVar117,auVar290);
  auVar133 = psubsw(auVar117,auVar290);
  auVar117 = paddsw(auVar311,auVar105);
  auVar142 = psubsw(auVar311,auVar105);
  auVar105 = paddsw(auVar398,auVar215);
  auVar291 = psubsw(auVar398,auVar215);
  auVar215 = paddsw(auVar329,auVar274);
  auVar305 = psubsw(auVar329,auVar274);
  auVar398 = paddsw(auVar333,auVar121);
  auVar121 = psubsw(auVar333,auVar121);
  auVar311 = paddsw(auVar400,auVar171);
  auVar7 = psubsw(auVar400,auVar171);
  auVar329 = paddsw(auVar294,auVar67);
  auVar431 = psubsw(auVar294,auVar67);
  auVar294 = paddsw(auVar113,auVar139);
  auVar400 = psubsw(auVar113,auVar139);
  auVar113 = paddsw(auVar103,auVar6);
  auVar164 = psubsw(auVar103,auVar6);
  auVar333 = paddsw(auVar213,auVar63);
  auVar213 = psubsw(auVar213,auVar63);
  auVar62 = paddsw(auVar217,auVar485);
  auVar103 = psubsw(auVar217,auVar485);
  auVar217 = paddsw(auVar288,auVar354);
  auVar288 = psubsw(auVar288,auVar354);
  auVar354 = paddsw(auVar256,auVar111);
  auVar6 = psubsw(auVar256,auVar111);
  auVar290 = paddsw(auVar65,auVar491);
  auVar2 = psubsw(auVar65,auVar491);
  auVar65 = paddsw(auVar452,auVar385);
  auVar119 = psubsw(auVar452,auVar385);
  auVar375._0_12_ = auVar131._0_12_;
  auVar375._12_2_ = auVar131._6_2_;
  auVar375._14_2_ = auVar109._6_2_;
  auVar374._12_4_ = auVar375._12_4_;
  auVar374._0_10_ = auVar131._0_10_;
  auVar374._10_2_ = auVar109._4_2_;
  auVar373._10_6_ = auVar374._10_6_;
  auVar373._0_8_ = auVar131._0_8_;
  auVar373._8_2_ = auVar131._4_2_;
  auVar372._8_8_ = auVar373._8_8_;
  auVar372._6_2_ = auVar109._2_2_;
  auVar372._4_2_ = auVar131._2_2_;
  auVar372._0_2_ = auVar131._0_2_;
  auVar372._2_2_ = auVar109._0_2_;
  auVar321._2_2_ = auVar109._8_2_;
  auVar321._0_2_ = auVar131._8_2_;
  auVar321._4_2_ = auVar131._10_2_;
  auVar321._6_2_ = auVar109._10_2_;
  auVar321._8_2_ = auVar131._12_2_;
  auVar321._10_2_ = auVar109._12_2_;
  auVar321._12_2_ = auVar131._14_2_;
  auVar321._14_2_ = auVar109._14_2_;
  auVar452 = pmaddwd(auVar372,auVar275);
  auVar396 = pmaddwd(auVar321,auVar275);
  auVar92._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar92._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar92._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar92._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar171._0_4_ = auVar396._0_4_ + 0x800 >> 0xc;
  auVar171._4_4_ = auVar396._4_4_ + 0x800 >> 0xc;
  auVar171._8_4_ = auVar396._8_4_ + 0x800 >> 0xc;
  auVar171._12_4_ = auVar396._12_4_ + 0x800 >> 0xc;
  auVar396 = packssdw(auVar92,auVar171);
  auVar109 = pmaddwd(auVar372,auVar150);
  auVar452 = pmaddwd(auVar321,auVar150);
  auVar376._0_4_ = auVar109._0_4_ + 0x800 >> 0xc;
  auVar376._4_4_ = auVar109._4_4_ + 0x800 >> 0xc;
  auVar376._8_4_ = auVar109._8_4_ + 0x800 >> 0xc;
  auVar376._12_4_ = auVar109._12_4_ + 0x800 >> 0xc;
  auVar322._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar322._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar322._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar322._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar385 = packssdw(auVar376,auVar322);
  auVar286._0_12_ = auVar4._0_12_;
  auVar286._12_2_ = auVar4._6_2_;
  auVar286._14_2_ = auVar451._6_2_;
  auVar285._12_4_ = auVar286._12_4_;
  auVar285._0_10_ = auVar4._0_10_;
  auVar285._10_2_ = auVar451._4_2_;
  auVar284._10_6_ = auVar285._10_6_;
  auVar284._0_8_ = auVar4._0_8_;
  auVar284._8_2_ = auVar4._4_2_;
  auVar283._8_8_ = auVar284._8_8_;
  auVar283._6_2_ = auVar451._2_2_;
  auVar283._4_2_ = auVar4._2_2_;
  auVar283._0_2_ = auVar4._0_2_;
  auVar283._2_2_ = auVar451._0_2_;
  auVar244._2_2_ = auVar451._8_2_;
  auVar244._0_2_ = auVar4._8_2_;
  auVar244._4_2_ = auVar4._10_2_;
  auVar244._6_2_ = auVar451._10_2_;
  auVar244._8_2_ = auVar4._12_2_;
  auVar244._10_2_ = auVar451._12_2_;
  auVar244._12_2_ = auVar4._14_2_;
  auVar244._14_2_ = auVar451._14_2_;
  auVar452 = pmaddwd(auVar283,auVar275);
  auVar4 = pmaddwd(auVar244,auVar275);
  auVar93._0_4_ = auVar452._0_4_ + 0x800 >> 0xc;
  auVar93._4_4_ = auVar452._4_4_ + 0x800 >> 0xc;
  auVar93._8_4_ = auVar452._8_4_ + 0x800 >> 0xc;
  auVar93._12_4_ = auVar452._12_4_ + 0x800 >> 0xc;
  auVar451._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar451._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar451._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar451._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar452 = packssdw(auVar93,auVar451);
  auVar109 = pmaddwd(auVar283,auVar150);
  auVar4 = pmaddwd(auVar244,auVar150);
  auVar287._0_4_ = auVar109._0_4_ + 0x800 >> 0xc;
  auVar287._4_4_ = auVar109._4_4_ + 0x800 >> 0xc;
  auVar287._8_4_ = auVar109._8_4_ + 0x800 >> 0xc;
  auVar287._12_4_ = auVar109._12_4_ + 0x800 >> 0xc;
  auVar245._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar245._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar245._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar245._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar63 = packssdw(auVar287,auVar245);
  auVar412._0_12_ = auVar3._0_12_;
  auVar412._12_2_ = auVar3._6_2_;
  auVar412._14_2_ = auVar218._6_2_;
  auVar411._12_4_ = auVar412._12_4_;
  auVar411._0_10_ = auVar3._0_10_;
  auVar411._10_2_ = auVar218._4_2_;
  auVar410._10_6_ = auVar411._10_6_;
  auVar410._0_8_ = auVar3._0_8_;
  auVar410._8_2_ = auVar3._4_2_;
  auVar409._8_8_ = auVar410._8_8_;
  auVar409._6_2_ = auVar218._2_2_;
  auVar409._4_2_ = auVar3._2_2_;
  auVar409._0_2_ = auVar3._0_2_;
  auVar409._2_2_ = auVar218._0_2_;
  auVar94._2_2_ = auVar218._8_2_;
  auVar94._0_2_ = auVar3._8_2_;
  auVar94._4_2_ = auVar3._10_2_;
  auVar94._6_2_ = auVar218._10_2_;
  auVar94._8_2_ = auVar3._12_2_;
  auVar94._10_2_ = auVar218._12_2_;
  auVar94._12_2_ = auVar3._14_2_;
  auVar94._14_2_ = auVar218._14_2_;
  auVar4 = pmaddwd(auVar409,auVar275);
  auVar3 = pmaddwd(auVar94,auVar275);
  auVar246._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar246._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar246._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar246._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar218._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar218._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar218._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar218._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar109 = packssdw(auVar246,auVar218);
  auVar4 = pmaddwd(auVar409,auVar150);
  auVar3 = pmaddwd(auVar94,auVar150);
  auVar413._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar413._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar413._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar413._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar95._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar95._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar95._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar95._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar67 = packssdw(auVar413,auVar95);
  local_198 = auVar5._0_2_;
  uStack_196 = auVar5._2_2_;
  uStack_194 = auVar5._4_2_;
  uStack_192 = auVar5._6_2_;
  uStack_190 = auVar5._8_2_;
  uStack_18e = auVar5._10_2_;
  uStack_18c = auVar5._12_2_;
  uStack_18a = auVar5._14_2_;
  auVar477._0_12_ = auVar437._0_12_;
  auVar477._12_2_ = auVar437._6_2_;
  auVar477._14_2_ = uStack_192;
  auVar476._12_4_ = auVar477._12_4_;
  auVar476._0_10_ = auVar437._0_10_;
  auVar476._10_2_ = uStack_194;
  auVar475._10_6_ = auVar476._10_6_;
  auVar475._0_8_ = auVar437._0_8_;
  auVar475._8_2_ = auVar437._4_2_;
  auVar474._8_8_ = auVar475._8_8_;
  auVar474._6_2_ = uStack_196;
  auVar474._4_2_ = auVar437._2_2_;
  auVar474._0_2_ = auVar437._0_2_;
  auVar474._2_2_ = local_198;
  auVar96._2_2_ = uStack_190;
  auVar96._0_2_ = auVar437._8_2_;
  auVar96._4_2_ = auVar437._10_2_;
  auVar96._6_2_ = uStack_18e;
  auVar96._8_2_ = auVar437._12_2_;
  auVar96._10_2_ = uStack_18c;
  auVar96._12_2_ = auVar437._14_2_;
  auVar96._14_2_ = uStack_18a;
  auVar4 = pmaddwd(auVar474,auVar275);
  auVar3 = pmaddwd(auVar96,auVar275);
  auVar247._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar247._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar247._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar247._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar223._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar223._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar223._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar223._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar111 = packssdw(auVar247,auVar223);
  auVar4 = pmaddwd(auVar474,auVar150);
  auVar3 = pmaddwd(auVar96,auVar150);
  auVar478._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar478._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar478._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar478._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar97._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar97._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar97._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar97._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar131 = packssdw(auVar478,auVar97);
  local_188 = auVar66._0_2_;
  uStack_186 = auVar66._2_2_;
  uStack_184 = auVar66._4_2_;
  uStack_182 = auVar66._6_2_;
  uStack_180 = auVar66._8_2_;
  uStack_17e = auVar66._10_2_;
  uStack_17c = auVar66._12_2_;
  uStack_17a = auVar66._14_2_;
  auVar326._0_12_ = auVar421._0_12_;
  auVar326._12_2_ = auVar421._6_2_;
  auVar326._14_2_ = uStack_182;
  auVar325._12_4_ = auVar326._12_4_;
  auVar325._0_10_ = auVar421._0_10_;
  auVar325._10_2_ = uStack_184;
  auVar324._10_6_ = auVar325._10_6_;
  auVar324._0_8_ = auVar421._0_8_;
  auVar324._8_2_ = auVar421._4_2_;
  auVar323._8_8_ = auVar324._8_8_;
  auVar323._6_2_ = uStack_186;
  auVar323._4_2_ = auVar421._2_2_;
  auVar323._0_2_ = auVar421._0_2_;
  auVar323._2_2_ = local_188;
  auVar98._2_2_ = uStack_180;
  auVar98._0_2_ = auVar421._8_2_;
  auVar98._4_2_ = auVar421._10_2_;
  auVar98._6_2_ = uStack_17e;
  auVar98._8_2_ = auVar421._12_2_;
  auVar98._10_2_ = uStack_17c;
  auVar98._12_2_ = auVar421._14_2_;
  auVar98._14_2_ = uStack_17a;
  auVar4 = pmaddwd(auVar323,auVar275);
  auVar3 = pmaddwd(auVar98,auVar275);
  auVar448._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar448._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar448._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar448._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar250._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar250._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar250._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar250._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar437 = packssdw(auVar448,auVar250);
  auVar4 = pmaddwd(auVar323,auVar150);
  auVar3 = pmaddwd(auVar98,auVar150);
  auVar327._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar327._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar327._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar327._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar99._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar99._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar99._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar99._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar421 = packssdw(auVar327,auVar99);
  local_178 = auVar483._0_2_;
  uStack_176 = auVar483._2_2_;
  uStack_174 = auVar483._4_2_;
  uStack_172 = auVar483._6_2_;
  uStack_170 = auVar483._8_2_;
  uStack_16e = auVar483._10_2_;
  uStack_16c = auVar483._12_2_;
  uStack_16a = auVar483._14_2_;
  auVar428._0_12_ = auVar378._0_12_;
  auVar428._12_2_ = auVar378._6_2_;
  auVar428._14_2_ = uStack_172;
  auVar427._12_4_ = auVar428._12_4_;
  auVar427._0_10_ = auVar378._0_10_;
  auVar427._10_2_ = uStack_174;
  auVar426._10_6_ = auVar427._10_6_;
  auVar426._0_8_ = auVar378._0_8_;
  auVar426._8_2_ = auVar378._4_2_;
  auVar425._8_8_ = auVar426._8_8_;
  auVar425._6_2_ = uStack_176;
  auVar425._4_2_ = auVar378._2_2_;
  auVar425._0_2_ = auVar378._0_2_;
  auVar425._2_2_ = local_178;
  auVar100._2_2_ = uStack_170;
  auVar100._0_2_ = auVar378._8_2_;
  auVar100._4_2_ = auVar378._10_2_;
  auVar100._6_2_ = uStack_16e;
  auVar100._8_2_ = auVar378._12_2_;
  auVar100._10_2_ = uStack_16c;
  auVar100._12_2_ = auVar378._14_2_;
  auVar100._14_2_ = uStack_16a;
  auVar4 = pmaddwd(auVar425,auVar275);
  auVar3 = pmaddwd(auVar100,auVar275);
  auVar248._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar248._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar248._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar248._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar252._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar252._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar252._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar252._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar256 = packssdw(auVar248,auVar252);
  auVar4 = pmaddwd(auVar425,auVar150);
  auVar3 = pmaddwd(auVar100,auVar150);
  auVar429._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar429._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar429._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar429._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar101._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar101._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar101._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar101._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar378 = packssdw(auVar429,auVar101);
  local_78 = auVar480._0_2_;
  uStack_76 = auVar480._2_2_;
  uStack_74 = auVar480._4_2_;
  uStack_72 = auVar480._6_2_;
  uStack_70 = auVar480._8_2_;
  uStack_6e = auVar480._10_2_;
  uStack_6c = auVar480._12_2_;
  uStack_6a = auVar480._14_2_;
  auVar496._0_12_ = auVar363._0_12_;
  auVar496._12_2_ = auVar363._6_2_;
  auVar496._14_2_ = uStack_72;
  auVar495._12_4_ = auVar496._12_4_;
  auVar495._0_10_ = auVar363._0_10_;
  auVar495._10_2_ = uStack_74;
  auVar494._10_6_ = auVar495._10_6_;
  auVar494._0_8_ = auVar363._0_8_;
  auVar494._8_2_ = auVar363._4_2_;
  auVar493._8_8_ = auVar494._8_8_;
  auVar493._6_2_ = uStack_76;
  auVar493._4_2_ = auVar363._2_2_;
  auVar493._0_2_ = auVar363._0_2_;
  auVar493._2_2_ = local_78;
  auVar346._2_2_ = uStack_70;
  auVar346._0_2_ = auVar363._8_2_;
  auVar346._4_2_ = auVar363._10_2_;
  auVar346._6_2_ = uStack_6e;
  auVar346._8_2_ = auVar363._12_2_;
  auVar346._10_2_ = uStack_6c;
  auVar346._12_2_ = auVar363._14_2_;
  auVar346._14_2_ = uStack_6a;
  auVar4 = pmaddwd(auVar493,auVar275);
  auVar3 = pmaddwd(auVar346,auVar275);
  auVar102._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar102._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar102._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar102._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar272._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar272._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar272._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar272._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar102,auVar272);
  auVar4 = pmaddwd(auVar493,auVar150);
  auVar3 = pmaddwd(auVar346,auVar150);
  auVar497._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar497._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar497._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar497._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar347._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar347._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar347._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar347._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar363 = packssdw(auVar497,auVar347);
  local_168 = auVar450._0_2_;
  uStack_166 = auVar450._2_2_;
  uStack_164 = auVar450._4_2_;
  uStack_162 = auVar450._6_2_;
  uStack_160 = auVar450._8_2_;
  uStack_15e = auVar450._10_2_;
  uStack_15c = auVar450._12_2_;
  uStack_15a = auVar450._14_2_;
  auVar351._0_12_ = auVar454._0_12_;
  auVar351._12_2_ = auVar454._6_2_;
  auVar351._14_2_ = uStack_162;
  auVar350._12_4_ = auVar351._12_4_;
  auVar350._0_10_ = auVar454._0_10_;
  auVar350._10_2_ = uStack_164;
  auVar349._10_6_ = auVar350._10_6_;
  auVar349._0_8_ = auVar454._0_8_;
  auVar349._8_2_ = auVar454._4_2_;
  auVar348._8_8_ = auVar349._8_8_;
  auVar348._6_2_ = uStack_166;
  auVar348._4_2_ = auVar454._2_2_;
  auVar348._0_2_ = auVar454._0_2_;
  auVar348._2_2_ = local_168;
  auVar391._2_2_ = uStack_160;
  auVar391._0_2_ = auVar454._8_2_;
  auVar391._4_2_ = auVar454._10_2_;
  auVar391._6_2_ = uStack_15e;
  auVar391._8_2_ = auVar454._12_2_;
  auVar391._10_2_ = uStack_15c;
  auVar391._12_2_ = auVar454._14_2_;
  auVar391._14_2_ = uStack_15a;
  auVar3 = pmaddwd(auVar348,auVar275);
  auVar4 = pmaddwd(auVar275,auVar391);
  auVar454 = pmaddwd(auVar348,auVar150);
  auVar66 = pmaddwd(auVar391,auVar150);
  auVar274._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar274._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar274._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar274._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar52._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar52._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar52._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar52._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar3 = packssdw(auVar274,auVar52);
  auVar352._0_4_ = auVar454._0_4_ + 0x800 >> 0xc;
  auVar352._4_4_ = auVar454._4_4_ + 0x800 >> 0xc;
  auVar352._8_4_ = auVar454._8_4_ + 0x800 >> 0xc;
  auVar352._12_4_ = auVar454._12_4_ + 0x800 >> 0xc;
  auVar392._0_4_ = auVar66._0_4_ + 0x800 >> 0xc;
  auVar392._4_4_ = auVar66._4_4_ + 0x800 >> 0xc;
  auVar392._8_4_ = auVar66._8_4_ + 0x800 >> 0xc;
  auVar392._12_4_ = auVar66._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar352,auVar392);
  alVar393 = (__m128i)paddsw(auVar312,auVar254);
  *output = alVar393;
  alVar393 = (__m128i)psubsw(auVar312,auVar254);
  output[0x3f] = alVar393;
  alVar393 = (__m128i)paddsw(auVar177,auVar360);
  output[1] = alVar393;
  alVar393 = (__m128i)psubsw(auVar177,auVar360);
  output[0x3e] = alVar393;
  alVar393 = (__m128i)paddsw(auVar117,auVar160);
  output[2] = alVar393;
  alVar393 = (__m128i)psubsw(auVar117,auVar160);
  output[0x3d] = alVar393;
  alVar393 = (__m128i)paddsw(auVar105,auVar162);
  output[3] = alVar393;
  alVar393 = (__m128i)psubsw(auVar105,auVar162);
  output[0x3c] = alVar393;
  alVar393 = (__m128i)paddsw(auVar215,auVar115);
  output[4] = alVar393;
  alVar393 = (__m128i)psubsw(auVar215,auVar115);
  output[0x3b] = alVar393;
  alVar393 = (__m128i)paddsw(auVar398,auVar107);
  output[5] = alVar393;
  alVar393 = (__m128i)psubsw(auVar398,auVar107);
  output[0x3a] = alVar393;
  alVar393 = (__m128i)paddsw(auVar311,auVar415);
  output[6] = alVar393;
  alVar393 = (__m128i)psubsw(auVar311,auVar415);
  output[0x39] = alVar393;
  alVar393 = (__m128i)paddsw(auVar329,auVar129);
  output[7] = alVar393;
  alVar393 = (__m128i)psubsw(auVar329,auVar129);
  output[0x38] = alVar393;
  alVar393 = (__m128i)paddsw(auVar294,auVar385);
  output[8] = alVar393;
  alVar393 = (__m128i)psubsw(auVar294,auVar385);
  output[0x37] = alVar393;
  alVar393 = (__m128i)paddsw(auVar113,auVar63);
  output[9] = alVar393;
  alVar393 = (__m128i)psubsw(auVar113,auVar63);
  output[0x36] = alVar393;
  alVar393 = (__m128i)paddsw(auVar333,auVar67);
  output[10] = alVar393;
  alVar393 = (__m128i)psubsw(auVar333,auVar67);
  output[0x35] = alVar393;
  alVar393 = (__m128i)paddsw(auVar62,auVar131);
  output[0xb] = alVar393;
  alVar393 = (__m128i)psubsw(auVar62,auVar131);
  output[0x34] = alVar393;
  alVar393 = (__m128i)paddsw(auVar217,auVar421);
  output[0xc] = alVar393;
  alVar393 = (__m128i)psubsw(auVar217,auVar421);
  output[0x33] = alVar393;
  alVar393 = (__m128i)paddsw(auVar354,auVar378);
  output[0xd] = alVar393;
  alVar393 = (__m128i)psubsw(auVar354,auVar378);
  output[0x32] = alVar393;
  alVar393 = (__m128i)paddsw(auVar290,auVar363);
  output[0xe] = alVar393;
  alVar393 = (__m128i)psubsw(auVar290,auVar363);
  output[0x31] = alVar393;
  alVar393 = (__m128i)paddsw(auVar65,auVar4);
  output[0xf] = alVar393;
  alVar393 = (__m128i)psubsw(auVar65,auVar4);
  output[0x30] = alVar393;
  alVar393 = (__m128i)paddsw(auVar119,auVar3);
  output[0x10] = alVar393;
  alVar393 = (__m128i)psubsw(auVar119,auVar3);
  output[0x2f] = alVar393;
  alVar393 = (__m128i)paddsw(auVar2,auVar5);
  output[0x11] = alVar393;
  alVar393 = (__m128i)psubsw(auVar2,auVar5);
  output[0x2e] = alVar393;
  alVar393 = (__m128i)paddsw(auVar6,auVar256);
  output[0x12] = alVar393;
  alVar393 = (__m128i)psubsw(auVar6,auVar256);
  output[0x2d] = alVar393;
  alVar393 = (__m128i)paddsw(auVar288,auVar437);
  output[0x13] = alVar393;
  alVar393 = (__m128i)psubsw(auVar288,auVar437);
  output[0x2c] = alVar393;
  alVar393 = (__m128i)paddsw(auVar103,auVar111);
  output[0x14] = alVar393;
  alVar393 = (__m128i)psubsw(auVar103,auVar111);
  output[0x2b] = alVar393;
  alVar393 = (__m128i)paddsw(auVar213,auVar109);
  output[0x15] = alVar393;
  alVar393 = (__m128i)psubsw(auVar213,auVar109);
  output[0x2a] = alVar393;
  alVar393 = (__m128i)paddsw(auVar164,auVar452);
  output[0x16] = alVar393;
  alVar393 = (__m128i)psubsw(auVar164,auVar452);
  output[0x29] = alVar393;
  alVar393 = (__m128i)paddsw(auVar400,auVar396);
  output[0x17] = alVar393;
  alVar393 = (__m128i)psubsw(auVar400,auVar396);
  output[0x28] = alVar393;
  alVar393 = (__m128i)paddsw(auVar431,auVar395);
  output[0x18] = alVar393;
  alVar393 = (__m128i)psubsw(auVar431,auVar395);
  output[0x27] = alVar393;
  alVar393 = (__m128i)paddsw(auVar7,auVar54);
  output[0x19] = alVar393;
  alVar393 = (__m128i)psubsw(auVar7,auVar54);
  output[0x26] = alVar393;
  alVar393 = (__m128i)paddsw(auVar121,auVar140);
  output[0x1a] = alVar393;
  alVar393 = (__m128i)psubsw(auVar121,auVar140);
  output[0x25] = alVar393;
  alVar393 = (__m128i)paddsw(auVar305,auVar389);
  output[0x1b] = alVar393;
  alVar393 = (__m128i)psubsw(auVar305,auVar389);
  output[0x24] = alVar393;
  alVar393 = (__m128i)paddsw(auVar291,auVar456);
  output[0x1c] = alVar393;
  alVar393 = (__m128i)psubsw(auVar291,auVar456);
  output[0x23] = alVar393;
  alVar393 = (__m128i)paddsw(auVar142,auVar440);
  output[0x1d] = alVar393;
  alVar393 = (__m128i)psubsw(auVar142,auVar440);
  output[0x22] = alVar393;
  alVar393 = (__m128i)paddsw(auVar133,auVar438);
  output[0x1e] = alVar393;
  alVar393 = (__m128i)psubsw(auVar133,auVar438);
  output[0x21] = alVar393;
  alVar393 = (__m128i)paddsw(auVar9,auVar481);
  output[0x1f] = alVar393;
  alVar393 = (__m128i)psubsw(auVar9,auVar481);
  output[0x20] = alVar393;
  return;
}

Assistant:

static void idct64_low16_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[64];
  x[0] = input[0];
  x[4] = input[8];
  x[8] = input[4];
  x[12] = input[12];
  x[16] = input[2];
  x[20] = input[10];
  x[24] = input[6];
  x[28] = input[14];
  x[32] = input[1];
  x[36] = input[9];
  x[40] = input[5];
  x[44] = input[13];
  x[48] = input[3];
  x[52] = input[11];
  x[56] = input[7];
  x[60] = input[15];

  // stage 2
  btf_16_ssse3(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_ssse3(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_ssse3(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_ssse3(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_ssse3(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_ssse3(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_ssse3(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_ssse3(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_ssse3(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);
  x[33] = x[32];
  x[34] = x[35];
  x[37] = x[36];
  x[38] = x[39];
  x[41] = x[40];
  x[42] = x[43];
  x[45] = x[44];
  x[46] = x[47];
  x[49] = x[48];
  x[50] = x[51];
  x[53] = x[52];
  x[54] = x[55];
  x[57] = x[56];
  x[58] = x[59];
  x[61] = x[60];
  x[62] = x[63];

  // stage 4
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);
  x[17] = x[16];
  x[18] = x[19];
  x[21] = x[20];
  x[22] = x[23];
  x[25] = x[24];
  x[26] = x[27];
  x[29] = x[28];
  x[30] = x[31];
  idct64_stage4_high32_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  x[9] = x[8];
  x[10] = x[11];
  x[13] = x[12];
  x[14] = x[15];
  idct64_stage5_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 6
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  x[5] = x[4];
  x[6] = x[7];
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);
  idct64_stage6_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 7
  x[3] = x[0];
  x[2] = x[1];
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);
  idct64_stage7_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 8
  btf_16_adds_subs_sse2(x[0], x[7]);
  btf_16_adds_subs_sse2(x[1], x[6]);
  btf_16_adds_subs_sse2(x[2], x[5]);
  btf_16_adds_subs_sse2(x[3], x[4]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);
  idct64_stage8_high48_sse2(x, cospi, __rounding, cos_bit);

  idct64_stage9_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage10_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage11_sse2(output, x);
}